

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

void MIR_link(MIR_context_t ctx,_func_void_MIR_context_t_MIR_item_t *set_interface,
             _func_void_ptr_char_ptr *import_resolver)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined4 uVar9;
  VARR_uint8_t *pVVar10;
  VARR_MIR_op_t *pVVar11;
  MIR_type_t *pMVar12;
  MIR_op_t *pMVar13;
  MIR_lref_data *pMVar14;
  MIR_lref_data_t pMVar15;
  VARR_MIR_var_t *pVVar16;
  MIR_var_t *pMVar17;
  MIR_context_t ctx_00;
  long lVar18;
  MIR_label_t pMVar19;
  anon_union_8_10_166bea1d_for_u aVar20;
  MIR_op_t op1;
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  bool bVar30;
  bool bVar31;
  void **ppvVar32;
  undefined6 uVar33;
  uint32_t uVar34;
  MIR_insn_code_t MVar35;
  MIR_reg_t MVar36;
  MIR_insn_t_conflict *ppMVar37;
  anon_union_8_10_166bea1d_for_u *before;
  void *pvVar38;
  anon_union_8_10_166bea1d_for_u *paVar39;
  simplify_ctx *psVar40;
  MIR_func_t pMVar41;
  MIR_func_t extraout_RAX;
  MIR_func_t pMVar42;
  ulong uVar43;
  anon_union_8_10_166bea1d_for_u *paVar44;
  reg_desc_t *prVar45;
  MIR_insn_t_conflict pMVar46;
  MIR_insn_t_conflict pMVar47;
  MIR_insn_t pMVar48;
  MIR_insn_t_conflict pMVar49;
  anon_union_8_10_166bea1d_for_u *paVar50;
  MIR_insn_t_conflict pMVar51;
  MIR_func_t extraout_RAX_00;
  uint uVar52;
  uint uVar53;
  MIR_insn_t_conflict insn;
  MIR_func_t pMVar54;
  VARR_MIR_insn_t *pVVar55;
  MIR_item_t pMVar56;
  MIR_insn_t pMVar57;
  MIR_module_t_conflict pMVar58;
  MIR_module_t_conflict pMVar59;
  void *pvVar60;
  ulong uVar61;
  long lVar62;
  VARR_MIR_insn_t *extraout_RDX;
  VARR_MIR_insn_t *pVVar63;
  VARR_MIR_insn_t *extraout_RDX_00;
  VARR_MIR_insn_t *extraout_RDX_01;
  size_t sVar64;
  ulong uVar65;
  int *piVar66;
  MIR_type_t MVar67;
  MIR_func_t pMVar68;
  MIR_item_t pMVar69;
  char *pcVar70;
  MIR_insn_code_t MVar71;
  int iVar72;
  undefined8 uVar73;
  int iVar74;
  MIR_item_t pMVar75;
  anon_union_8_10_166bea1d_for_u *unaff_R13;
  anon_union_8_10_166bea1d_for_u *unaff_R14;
  MIR_item_t_conflict pMVar76;
  bool bVar77;
  undefined1 auVar78 [16];
  undefined1 in_ZMM1 [64];
  int func_top_alloca_used_p;
  int64_t alloca_size;
  int called_func_top_alloca_used_p;
  int non_top_alloca_p;
  MIR_item_t_conflict tab_item;
  anon_union_16_8_da7ae194 v;
  MIR_op_t reg_op;
  MIR_op_t op_3;
  MIR_op_t size;
  MIR_op_t op_1;
  MIR_op_t op;
  MIR_op_t op_13;
  MIR_op_t op_12;
  MIR_op_t op_2;
  MIR_op_t op_25;
  MIR_op_t op_24;
  MIR_op_t op_23;
  MIR_op_t op_22;
  MIR_op_t op_21;
  MIR_op_t op_20;
  MIR_op_t op_19;
  MIR_op_t op_18;
  MIR_op_t op_17;
  MIR_op_t op_4;
  MIR_op_t op_15;
  MIR_op_t op_14;
  MIR_op_t op_11;
  int in_stack_fffffffffffff8e0;
  anon_union_8_10_166bea1d_for_u *local_698;
  MIR_item_t local_680;
  MIR_func_t local_678;
  anon_union_8_10_166bea1d_for_u *local_660;
  anon_union_8_10_166bea1d_for_u *local_658;
  anon_union_8_10_166bea1d_for_u *local_638;
  MIR_item_t local_630;
  uint local_628;
  int local_624;
  MIR_insn_t_conflict local_620;
  MIR_item_t local_618;
  undefined1 local_610 [40];
  anon_union_8_10_166bea1d_for_u local_5e8;
  anon_union_32_12_57d33f68_for_u aStack_5e0;
  MIR_func_t local_5c0;
  unkbyte10 local_5b8;
  undefined1 local_5a8;
  undefined1 uStack_5a7;
  undefined2 uStack_5a6;
  undefined4 uStack_5a4;
  undefined2 uStack_5a0;
  ulong local_590;
  MIR_insn_t_conflict local_588;
  _func_void_MIR_context_t_MIR_item_t *local_580;
  MIR_item local_578;
  undefined8 local_528;
  undefined1 uStack_520;
  undefined1 uStack_51f;
  undefined6 uStack_51e;
  MIR_reg_t MStack_518;
  undefined4 uStack_514;
  undefined8 uStack_510;
  anon_union_8_10_166bea1d_for_u local_4f8;
  undefined1 uStack_4f0;
  undefined1 uStack_4ef;
  undefined6 uStack_4ee;
  MIR_reg_t MStack_4e8;
  undefined4 uStack_4e4;
  MIR_func_t pMStack_4e0;
  MIR_func_t pMStack_4d8;
  MIR_func_t pMStack_4d0;
  undefined8 local_468;
  undefined1 uStack_460;
  undefined1 uStack_45f;
  MIR_reg_t MStack_458;
  undefined8 local_438;
  undefined1 uStack_430;
  undefined1 uStack_42f;
  undefined6 uStack_42e;
  MIR_reg_t MStack_428;
  undefined4 uStack_424;
  undefined8 uStack_420;
  ulong local_400;
  anon_union_8_10_166bea1d_for_u local_3f8;
  int *local_3f0;
  MIR_insn_t_conflict local_3e8;
  anon_union_8_10_166bea1d_for_u *local_3e0;
  ulong local_3d8;
  ulong local_3d0;
  undefined8 local_3c8;
  undefined2 uStack_3c0;
  undefined2 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  MIR_reg_t local_3a8;
  undefined4 local_3a4;
  undefined8 local_3a0;
  undefined8 local_398;
  undefined2 uStack_390;
  undefined2 uStack_388;
  undefined4 uStack_384;
  undefined4 uStack_380;
  undefined4 uStack_37c;
  MIR_reg_t local_378;
  undefined4 local_374;
  undefined8 local_370;
  undefined8 local_368;
  undefined1 uStack_360;
  undefined1 uStack_35f;
  anon_union_8_10_166bea1d_for_u *paStack_358;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined2 uStack_300;
  undefined6 uStack_2fe;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  undefined8 uStack_2f0;
  undefined8 local_2d8;
  undefined1 uStack_2d0;
  long lStack_2c8;
  undefined8 local_2a8;
  undefined1 uStack_2a0;
  undefined7 uStack_29f;
  MIR_reg_t MStack_298;
  undefined1 auStack_294 [12];
  undefined8 local_278;
  undefined1 uStack_270;
  MIR_reg_t MStack_268;
  undefined8 local_248;
  undefined1 uStack_240;
  undefined8 uStack_238;
  undefined8 local_218;
  undefined1 uStack_210;
  MIR_reg_t MStack_208;
  undefined8 local_1e8;
  undefined1 uStack_1e0;
  MIR_reg_t MStack_1d8;
  undefined8 local_1b8;
  undefined1 uStack_1b0;
  undefined7 uStack_1af;
  MIR_reg_t MStack_1a8;
  undefined1 auStack_1a4 [12];
  undefined8 local_188;
  undefined1 uStack_180;
  MIR_reg_t MStack_178;
  undefined8 local_158;
  undefined1 uStack_150;
  undefined4 uStack_148;
  undefined8 local_128;
  undefined1 uStack_120;
  undefined7 uStack_11f;
  undefined4 uStack_118;
  undefined1 auStack_114 [12];
  undefined8 local_f8;
  undefined2 uStack_f0;
  undefined4 uStack_e8;
  undefined8 local_c8;
  undefined1 uStack_c0;
  undefined7 uStack_bf;
  MIR_insn_t_conflict pMStack_b8;
  undefined8 uStack_b0;
  undefined8 local_98;
  undefined2 uStack_90;
  undefined8 uStack_88;
  undefined8 local_68;
  undefined2 uStack_60;
  MIR_insn_t_conflict pMStack_58;
  
  auVar78 = in_ZMM1._0_16_;
  pMVar41 = (MIR_func_t)ctx->modules_to_link;
  paVar50 = (anon_union_8_10_166bea1d_for_u *)ctx;
  local_580 = set_interface;
  if (pMVar41 != (MIR_func_t)0x0) {
    local_618 = (MIR_item_t)&ctx->environment_module;
    pMVar48 = (MIR_insn_t)0x0;
    local_610._32_8_ = import_resolver;
    do {
      unaff_R13 = (anon_union_8_10_166bea1d_for_u *)ctx;
      local_698 = (anon_union_8_10_166bea1d_for_u *)ctx;
      if ((MIR_insn_t)pMVar41->name <= pMVar48) goto LAB_00135034;
      local_610._8_8_ = pMVar48;
      if ((MIR_module_t_conflict *)pMVar41->original_vars_num == (MIR_module_t_conflict *)0x0) {
        MIR_link_cold_41();
LAB_00136fe2:
        MIR_link_cold_7();
        goto LAB_00136fe7;
      }
      pMVar75 = (MIR_item_t)((MIR_module_t_conflict *)pMVar41->original_vars_num)[(long)pMVar48];
      pVVar10 = ctx->used_label_p;
      ctx->simplify_ctx->new_label_num = 0;
      if ((pVVar10 == (VARR_uint8_t *)0x0) || (pVVar10->varr == (uint8_t *)0x0)) goto LAB_00136f75;
      pVVar10->els_num = 0;
      pMVar76 = ((DLIST_MIR_item_t *)&pMVar75->item_link)->head;
      if (pMVar76 != (MIR_item_t_conflict)0x0) {
        do {
          auVar78 = in_ZMM1._0_16_;
          switch(pMVar76->item_type) {
          case MIR_func_item:
            if (pMVar76->data != (void *)0x0) goto LAB_00136eda;
            paVar50 = (anon_union_8_10_166bea1d_for_u *)ctx->simplify_ctx->val_tab;
            in_ZMM1 = ZEXT1664(auVar78);
            HTAB_val_t_clear((HTAB_val_t *)paVar50);
            pMVar41 = (pMVar76->u).func;
            uVar34 = pMVar41->nargs;
            if (uVar34 != 0) {
              lVar62 = 8;
              uVar65 = 0;
              local_658 = unaff_R14;
              do {
                pVVar16 = pMVar41->vars;
                if (((pVVar16 == (VARR_MIR_var_t *)0x0) ||
                    (pMVar17 = pVVar16->varr, pMVar17 == (MIR_var_t *)0x0)) ||
                   (pVVar16->els_num <= uVar65)) {
                  MIR_link_cold_24();
                  goto LAB_00136dab;
                }
                pMVar54 = (MIR_func_t)(ulong)*(uint *)((long)pMVar17 + lVar62 + -8);
                unaff_R14 = local_658;
                if (pMVar54 < (MIR_func_t)0x6) {
                  unaff_R14 = *(anon_union_8_10_166bea1d_for_u **)((long)&pMVar17->type + lVar62);
                  MVar71 = *(MIR_insn_code_t *)(&DAT_001acb88 + (long)pMVar54 * 4);
                  prVar45 = find_rd_by_name((MIR_context_t)unaff_R14,(char *)pMVar41->internal,
                                            pMVar54);
                  if (prVar45 == (reg_desc_t *)0x0) goto LAB_00136def;
                  MStack_458 = prVar45->reg;
                  uStack_430 = 1;
                  local_438 = 0;
                  uStack_460 = 1;
                  local_468 = 0;
                  auVar78[9] = uStack_42f;
                  auVar78._0_9_ = (unkuint9)1 << 0x40;
                  auVar78._10_6_ = uStack_42e;
                  in_stack_fffffffffffff8e0 = auVar78._8_4_;
                  in_ZMM1 = ZEXT1664(CONCAT88(uStack_420,CONCAT44(uStack_424,MStack_458)));
                  MStack_428 = MStack_458;
                  pMVar51 = MIR_new_insn(ctx,MVar71);
                  paVar50 = (anon_union_8_10_166bea1d_for_u *)ctx;
                  MIR_prepend_insn(ctx,pMVar76,pMVar51);
                  uVar34 = pMVar41->nargs;
                }
                uVar65 = uVar65 + 1;
                lVar62 = lVar62 + 0x18;
                local_658 = unaff_R14;
              } while (uVar65 < uVar34);
            }
            psVar40 = ctx->simplify_ctx;
            pVVar63 = psVar40->temp_insns;
            if ((pVVar63 == (VARR_MIR_insn_t *)0x0) || (pVVar63->varr == (MIR_insn_t_conflict *)0x0)
               ) {
              MIR_link_cold_39();
            }
            else {
              pVVar63->els_num = 0;
              pVVar55 = psVar40->labels;
              if ((pVVar55 != (VARR_MIR_insn_t *)0x0) &&
                 (pVVar55->varr != (MIR_insn_t_conflict *)0x0)) {
                pVVar55->els_num = 0;
                paVar44 = (anon_union_8_10_166bea1d_for_u *)(pMVar41->insns).head;
                if (paVar44 == (anon_union_8_10_166bea1d_for_u *)0x0) {
                  bVar30 = false;
                }
                else {
                  bVar31 = false;
                  bVar30 = false;
                  iVar72 = 0;
                  local_658 = (anon_union_8_10_166bea1d_for_u *)((ulong)pVVar55 & 0xffffffff);
                  do {
                    paVar39 = (anon_union_8_10_166bea1d_for_u *)paVar44[3].func;
                    MVar71 = (MIR_insn_code_t)paVar39;
                    if (((MVar71 < MIR_EXT8) && (*(char *)(paVar44 + 5) == '\n')) &&
                       (*(char *)(paVar44 + 0xb) == '\n')) {
                      if (MVar71 == MIR_MOV) {
                        MVar67 = MIR_T_I64;
                      }
                      else if (MVar71 == MIR_FMOV) {
                        MVar67 = MIR_T_F;
                      }
                      else {
                        MVar67 = (MVar71 != MIR_DMOV) + MIR_T_D;
                      }
                      MStack_4e8 = new_temp_reg(ctx,MVar67,pMVar41);
                      local_4f8.func = (MIR_func_t)0x0;
                      uVar52 = ((uint)local_658 & 0xffffff00) + 1;
                      uStack_4f0 = (undefined1)uVar52;
                      uStack_4ef = (undefined1)(uVar52 >> 8);
                      local_658 = (anon_union_8_10_166bea1d_for_u *)(ulong)uVar52;
                      in_stack_fffffffffffff8e0 = SUB84(paVar44[5],0);
                      pMVar51 = MIR_new_insn(ctx,MVar71);
                      MIR_insert_insn_after(ctx,pMVar76,(MIR_insn_t_conflict)paVar44,pMVar51);
                      auVar6[8] = uStack_4f0;
                      auVar6._0_8_ = local_4f8.func;
                      auVar6[9] = uStack_4ef;
                      auVar6._10_6_ = uStack_4ee;
                      auVar6._16_4_ = MStack_4e8;
                      auVar6._20_4_ = uStack_4e4;
                      auVar6._24_8_ = pMStack_4e0;
                      auVar7._4_4_ = uStack_4e4;
                      auVar7._0_4_ = MStack_4e8;
                      auVar7._8_8_ = pMStack_4e0;
                      auVar7._16_8_ = pMStack_4d8;
                      auVar7._24_8_ = pMStack_4d0;
                      in_ZMM1 = ZEXT3264(auVar7);
                      *(undefined1 (*) [32])(paVar44 + 6) = auVar7;
                      *(undefined1 (*) [32])(paVar44 + 4) = auVar6;
                      unaff_R14 = paVar39;
                    }
                    auVar78 = in_ZMM1._0_16_;
                    if (MVar71 != MIR_LABEL) {
                      if (MVar71 == MIR_RET) {
                        pVVar63 = ctx->simplify_ctx->temp_insns;
                        ppMVar37 = pVVar63->varr;
                        if (ppMVar37 == (MIR_insn_t_conflict *)0x0) {
                          MIR_link_cold_26();
                          goto LAB_00136e2d;
                        }
                        goto LAB_00133f6b;
                      }
                      before = (anon_union_8_10_166bea1d_for_u *)paVar44[2].func;
                      if (MVar71 != MIR_ALLOCA) goto LAB_00134232;
                      if ((ushort)(*(byte *)(paVar44 + 0xb) - 3) < 2) {
                        pMVar54 = paVar44[0xc].func;
                        pMVar42 = (MIR_func_t)&DAT_00000001;
                        if (1 < (long)pMVar54) {
                          pMVar42 = pMVar54;
                        }
                        local_678 = (MIR_func_t)((ulong)((MIR_func_t)0x8 < pMVar54) * 8 + 8);
                        if (pMVar54 < (MIR_func_t)0x5) {
                          local_678 = (MIR_func_t)0x4;
                        }
                        if ((long)pMVar54 < 3) {
                          local_678 = pMVar42;
                        }
                        puVar3 = (undefined1 *)((long)&pMVar42[-1].first_lref + 7) + (long)local_678
                        ;
                        unaff_R14 = (anon_union_8_10_166bea1d_for_u *)
                                    (puVar3 + -((long)puVar3 % (long)local_678));
                        if (before == (anon_union_8_10_166bea1d_for_u *)0x0) {
                          before = (anon_union_8_10_166bea1d_for_u *)0x0;
                        }
                        else {
                          do {
                            auVar78 = in_ZMM1._0_16_;
                            if ((*(int *)(before + 3) != 0xad) ||
                               (1 < (ushort)(*(byte *)(before + 0xb) - 3))) break;
                            auVar6 = *(undefined1 (*) [32])(paVar44 + 6);
                            in_stack_fffffffffffff8e0 =
                                 SUB324(*(undefined1 (*) [32])(paVar44 + 4),8);
                            auVar78 = auVar6._0_16_;
                            op1.u._16_8_ = auVar6._16_8_;
                            op1._0_32_ = *(undefined1 (*) [32])(paVar44 + 4);
                            op1.u.mem.disp = auVar6._24_8_;
                            iVar74 = MIR_op_eq_p((MIR_context_t)paVar39,op1,
                                                 *(MIR_op_t *)(before + 4));
                            if (iVar74 != 0) break;
                            pMVar54 = before[0xc].func;
                            pMVar42 = (MIR_func_t)&DAT_00000001;
                            if (1 < (long)pMVar54) {
                              pMVar42 = pMVar54;
                            }
                            pMVar68 = (MIR_func_t)((ulong)((MIR_func_t)0x8 < pMVar54) * 8 + 8);
                            if (pMVar54 < (MIR_func_t)0x5) {
                              pMVar68 = (MIR_func_t)0x4;
                            }
                            if ((long)pMVar54 < 3) {
                              pMVar68 = pMVar42;
                            }
                            puVar3 = (undefined1 *)((long)&pMVar42[-1].first_lref + 7) +
                                     (long)pMVar68;
                            if (local_678 < pMVar68) {
                              puVar2 = (undefined1 *)((long)&pMVar68[-1].first_lref + 7) +
                                       (long)unaff_R14;
                              unaff_R14 = (anon_union_8_10_166bea1d_for_u *)
                                          (puVar2 + -((long)puVar2 % (long)pMVar68));
                              local_678 = pMVar68;
                            }
                            uStack_360 = 3;
                            local_368 = 0;
                            in_stack_fffffffffffff8e0 = SUB324(*(undefined1 (*) [32])(before + 4),8)
                            ;
                            in_ZMM1 = ZEXT1664(SUB3216(*(undefined1 (*) [32])(before + 6),0));
                            paStack_358 = unaff_R14;
                            pMVar51 = MIR_new_insn(ctx,MIR_ADD);
                            unaff_R14 = (anon_union_8_10_166bea1d_for_u *)
                                        ((long)unaff_R14 +
                                        ((long)puVar3 - (long)puVar3 % (long)pMVar68));
                            MIR_insert_insn_before(ctx,pMVar76,(MIR_insn_t_conflict)before,pMVar51);
                            remove_insn(ctx,pMVar76,(MIR_insn_t_conflict)before,
                                        &((pMVar76->u).func)->insns);
                            auVar78 = in_ZMM1._0_16_;
                            before = (anon_union_8_10_166bea1d_for_u *)(pMVar51->insn_link).next;
                          } while (before != (anon_union_8_10_166bea1d_for_u *)0x0);
                          before = (anon_union_8_10_166bea1d_for_u *)paVar44[2].func;
                          bVar31 = bVar30;
                        }
                        paVar44[0xc].func = (MIR_func_t)unaff_R14;
                        goto LAB_00134232;
                      }
LAB_00134426:
                      bVar77 = before != (anon_union_8_10_166bea1d_for_u *)0x0;
                      goto LAB_0013442d;
                    }
                    pVVar63 = ctx->simplify_ctx->labels;
                    ppMVar37 = pVVar63->varr;
                    if (ppMVar37 == (MIR_insn_t_conflict *)0x0) {
LAB_00136e2d:
                      MIR_link_cold_25();
LAB_00136e35:
                      __assert_fail("ret_insn->ops[i].mode == MIR_OP_REG",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                    ,0x102b,"void process_inlines(MIR_context_t, MIR_item_t)");
                    }
LAB_00133f6b:
                    sVar64 = pVVar63->els_num;
                    uVar65 = sVar64 + 1;
                    if (pVVar63->size < uVar65) {
                      unaff_R14 = (anon_union_8_10_166bea1d_for_u *)((uVar65 >> 1) + uVar65);
                      ppMVar37 = (MIR_insn_t_conflict *)realloc(ppMVar37,(long)unaff_R14 * 8);
                      pVVar63->varr = ppMVar37;
                      pVVar63->size = (size_t)unaff_R14;
                      sVar64 = pVVar63->els_num;
                      uVar65 = sVar64 + 1;
                    }
                    pVVar63->els_num = uVar65;
                    ppMVar37[sVar64] = (MIR_insn_t_conflict)paVar44;
                    before = (anon_union_8_10_166bea1d_for_u *)paVar44[2].func;
LAB_00134232:
                    uVar52 = MVar71 - MIR_MULO;
                    bVar30 = bVar31;
                    if (0xfffffffc < MVar71 - MIR_SWITCH) {
                      bVar30 = true;
                    }
                    bVar31 = bVar30;
                    if (uVar52 < 0x33) {
                      if ((0x78f1e3c78c7f0U >> ((ulong)uVar52 & 0x3f) & 1) == 0) {
                        if ((3UL >> ((ulong)uVar52 & 0x3f) & 1) == 0) goto LAB_001342c7;
LAB_001342ea:
                        if ((*(char *)(paVar44 + 0x11) != '\x03') ||
                           (paVar44[0x12].func != (MIR_func_t)&DAT_00000001)) {
                          if (MVar71 - MIR_OR < 10) goto LAB_00134309;
                          goto LAB_00134320;
                        }
LAB_001343c8:
                        in_stack_fffffffffffff8e0 = SUB324(*(undefined1 (*) [32])(paVar44 + 4),8);
                        iVar72 = MIR_op_eq_p((MIR_context_t)paVar39,*(MIR_op_t *)(paVar44 + 4),
                                             *(MIR_op_t *)(paVar44 + 10));
                        if (iVar72 != 0) goto LAB_001344a9;
                        MVar71 = MIR_MOV;
LAB_00134472:
                        in_stack_fffffffffffff8e0 = SUB324(*(undefined1 (*) [32])(paVar44 + 4),8);
                        auVar78 = SUB3216(*(undefined1 (*) [32])(paVar44 + 6),0);
                        before = (anon_union_8_10_166bea1d_for_u *)MIR_new_insn(ctx,MVar71);
                        MIR_insert_insn_before
                                  (ctx,pMVar76,(MIR_insn_t_conflict)paVar44,
                                   (MIR_insn_t_conflict)before);
                      }
                      else {
                        if (*(char *)(paVar44 + 5) != '\f') {
LAB_00134292:
                          uVar53 = MVar71 - MIR_ADD;
                          if (uVar53 < 0x26) {
                            if ((0x3ff0000063U >> ((ulong)uVar53 & 0x3f) & 1) != 0)
                            goto LAB_00134309;
                            if ((0x18c00UL >> ((ulong)uVar53 & 0x3f) & 1) != 0) goto LAB_001342ea;
                          }
                          if (1 < uVar52) goto LAB_00134320;
                          goto LAB_001342ea;
                        }
                        for (paVar50 = before; paVar50 != (anon_union_8_10_166bea1d_for_u *)0x0;
                            paVar50 = (anon_union_8_10_166bea1d_for_u *)paVar50[2].func) {
                          if ((paVar50 == (anon_union_8_10_166bea1d_for_u *)paVar44[6].func) ||
                             (*(int *)(paVar50 + 3) != 0xb4)) goto LAB_00134289;
                        }
                        paVar50 = (anon_union_8_10_166bea1d_for_u *)0x0;
LAB_00134289:
                        if (paVar50 != (anon_union_8_10_166bea1d_for_u *)paVar44[6].func)
                        goto LAB_00134292;
                      }
LAB_001344a9:
                      in_ZMM1 = ZEXT1664(auVar78);
                      paVar50 = (anon_union_8_10_166bea1d_for_u *)ctx;
                      remove_insn(ctx,pMVar76,(MIR_insn_t_conflict)paVar44,
                                  &((pMVar76->u).func)->insns);
                      paVar44 = unaff_R14;
LAB_0013473e:
                      unaff_R14 = paVar44;
                      paVar44 = before;
                      iVar72 = 0;
                    }
                    else {
LAB_001342c7:
                      uVar52 = MVar71 - MIR_ADD;
                      if (uVar52 < 0x26) {
                        if ((0x3ff0000063U >> ((ulong)uVar52 & 0x3f) & 1) == 0) {
                          if ((0x18c00UL >> ((ulong)uVar52 & 0x3f) & 1) != 0) goto LAB_001342ea;
                        }
                        else {
LAB_00134309:
                          if ((*(char *)(paVar44 + 0x11) == '\x03') &&
                             (paVar44[0x12].func == (MIR_func_t)0x0)) goto LAB_001343c8;
                        }
                      }
LAB_00134320:
                      if ((0x2d < MVar71 - MIR_BT) ||
                         ((0x3c78f1e3c63fU >> ((ulong)(MVar71 - MIR_BT) & 0x3f) & 1) == 0))
                      goto LAB_00134426;
                      if (before != (anon_union_8_10_166bea1d_for_u *)0x0) {
                        bVar77 = true;
                        if (((*(int *)(before + 3) != 0x76) || (*(char *)(paVar44 + 5) != '\f')) ||
                           (*(char *)(before + 5) != '\f')) goto LAB_0013442d;
                        pMVar42 = paVar44[6].func;
                        pMVar54 = before[6].func;
                        for (pMVar68 = pMVar54; pMVar68 != (MIR_func_t)0x0;
                            pMVar68 = (MIR_func_t)pMVar68->original_vars_num) {
                          if ((pMVar68 == pMVar42) || (*(int *)&(pMVar68->insns).head != 0xb4))
                          goto LAB_00134391;
                        }
                        pMVar68 = (MIR_func_t)0x0;
LAB_00134391:
                        if (pMVar68 != pMVar42) {
                          for (; pMVar42 != (MIR_func_t)0x0;
                              pMVar42 = (MIR_func_t)pMVar42->original_vars_num) {
                            if ((pMVar42 == pMVar54) || (*(int *)&(pMVar42->insns).head != 0xb4))
                            goto LAB_0013475c;
                          }
                          pMVar42 = (MIR_func_t)0x0;
LAB_0013475c:
                          if (pMVar42 != pMVar54) goto LAB_0013442d;
                        }
                        in_ZMM1 = ZEXT1664(auVar78);
                        paVar50 = (anon_union_8_10_166bea1d_for_u *)ctx;
                        remove_insn(ctx,pMVar76,(MIR_insn_t_conflict)paVar44,
                                    &((pMVar76->u).func)->insns);
                        paVar44 = unaff_R14;
                        goto LAB_0013473e;
                      }
                      bVar77 = false;
                      before = (anon_union_8_10_166bea1d_for_u *)0x0;
LAB_0013442d:
                      if (((MVar71 - MIR_BT < 4) && (*(char *)(paVar44 + 0xb) == '\x03')) &&
                         (paVar44[0xc].func < (MIR_func_t)&DAT_00000002)) {
                        if (MVar71 - MIR_BT < 2 != (paVar44[0xc].func != (MIR_func_t)&DAT_00000001))
                        {
                          MVar71 = MIR_JMP;
                          goto LAB_00134472;
                        }
                        goto LAB_001344a9;
                      }
                      unaff_R14 = (anon_union_8_10_166bea1d_for_u *)paVar44[3].func;
                      in_ZMM1 = ZEXT1664(auVar78);
                      paVar50 = unaff_R14;
                      MVar35 = MIR_reverse_branch_code((MIR_insn_code_t)unaff_R14);
                      if (((!(bool)(MVar35 != MIR_INSN_BOUND & bVar77)) ||
                          (*(int *)(before + 3) != 0x76)) ||
                         ((pMVar54 = before[2].func, pMVar54 == (MIR_func_t)0x0 ||
                          ((*(int *)&(pMVar54->insns).head != 0xb4 ||
                           (*(char *)(paVar44 + 5) != '\f')))))) {
LAB_00134545:
                        if (((MVar71 - MIR_JMP < 0x2a) || (MVar71 - MIR_BO < 4)) ||
                           (MVar71 == MIR_LDBGE)) {
                          if ((*(char *)(paVar44 + 5) == '\f') &&
                             (pMVar54 = paVar44[6].func, pMVar54 != (MIR_func_t)0x0)) {
                            do {
                              iVar74 = *(int *)&(pMVar54->insns).head;
                              if (iVar74 != 0xb4) {
                                paVar50 = (anon_union_8_10_166bea1d_for_u *)
                                          CONCAT71((int7)((ulong)paVar50 >> 8),
                                                   iVar72 < 0x1f && iVar74 == 0x76);
                                if (iVar72 < 0x1f && iVar74 == 0x76) {
                                  auVar6 = *(undefined1 (*) [32])&(pMVar54->insns).tail;
                                  auVar7 = *(undefined1 (*) [32])&(pMVar54->original_insns).tail;
                                  in_ZMM1 = ZEXT3264(auVar7);
                                  iVar72 = iVar72 + 1;
                                  *(undefined1 (*) [32])(paVar44 + 6) = auVar7;
                                  *(undefined1 (*) [32])(paVar44 + 4) = auVar6;
                                  goto LAB_00134749;
                                }
                                break;
                              }
                              pMVar54 = (MIR_func_t)pMVar54->original_vars_num;
                            } while (pMVar54 != (MIR_func_t)0x0);
                            goto LAB_001345df;
                          }
LAB_001345f3:
                          uVar65 = 1;
                          if ((char)paVar39 == -0x5b) {
LAB_00134643:
                            uVar65 = 1;
                            uVar61 = 2;
                          }
                          else {
                            if ((MVar71 & (MIR_BNE|MIR_LDBEQ)) != MIR_SWITCH) goto LAB_00134628;
                            if ((ulong)unaff_R14 >> 0x21 == 0) goto LAB_001346a7;
                            uVar61 = (ulong)unaff_R14 >> 0x20;
                          }
LAB_0013464d:
                          do {
                            pMVar54 = paVar44[uVar65 * 6 + 6].func;
                            if (*(int *)&(pMVar54->insns).head != 0xb4) goto LAB_00136d60;
                            pMVar42 = pMVar54;
                            do {
                              pMVar68 = pMVar42;
                              pMVar42 = (MIR_func_t)pMVar68->original_vars_num;
                              if (pMVar42 == (MIR_func_t)0x0) break;
                            } while (*(int *)&(pMVar42->insns).head == 0xb4);
                            if (pMVar68 != pMVar54) {
                              paVar44[uVar65 * 6 + 6].func = pMVar68;
                            }
                            paVar50 = (anon_union_8_10_166bea1d_for_u *)ctx;
                            mark_used_label(ctx,(pMVar68->original_insns).tail);
                            uVar65 = uVar65 + 1;
                          } while (uVar65 != uVar61);
                          unaff_R14 = (anon_union_8_10_166bea1d_for_u *)paVar44[3].func;
                        }
                        else {
LAB_001345df:
                          if (MVar71 == MIR_SWITCH || MVar71 - MIR_JMP < 0x2f) goto LAB_001345f3;
                          if (MVar71 - MIR_PRBEQ < 2) {
LAB_00134628:
                            uVar61 = 1;
                            uVar65 = 0;
                            goto LAB_0013464d;
                          }
                          if (MVar71 == MIR_LADDR) goto LAB_00134643;
                        }
LAB_001346a7:
                        bVar31 = bVar30;
                        if ((ulong)unaff_R14 >> 0x20 != 0) {
                          sVar64 = 0;
                          do {
                            MIR_insn_op_mode(ctx,(MIR_insn_t_conflict)paVar44,sVar64,
                                             (int *)&local_578);
                            paVar50 = (anon_union_8_10_166bea1d_for_u *)ctx;
                            simplify_op(ctx,pMVar76,(MIR_insn_t_conflict)paVar44,(int)sVar64,
                                        (int)local_578.data,(MIR_insn_code_t)unaff_R14,
                                        (uint)(sVar64 == 1 && *(int *)(paVar44 + 3) - 0xa7U < 3),
                                        in_stack_fffffffffffff8e0);
                            sVar64 = sVar64 + 1;
                          } while ((ulong)unaff_R14 >> 0x20 != sVar64);
                        }
                        goto LAB_0013473e;
                      }
                      do {
                        if ((pMVar54 == paVar44[6].func) ||
                           (uVar52 = *(uint *)&(pMVar54->insns).head,
                           paVar50 = (anon_union_8_10_166bea1d_for_u *)(ulong)uVar52, uVar52 != 0xb4
                           )) goto LAB_0013453c;
                        pMVar54 = (MIR_func_t)pMVar54->original_vars_num;
                      } while (pMVar54 != (MIR_func_t)0x0);
                      pMVar54 = (MIR_func_t)0x0;
LAB_0013453c:
                      if (pMVar54 != paVar44[6].func) goto LAB_00134545;
                      auVar6 = *(undefined1 (*) [32])(before + 4);
                      auVar7 = *(undefined1 (*) [32])(before + 6);
                      unaff_R14 = (anon_union_8_10_166bea1d_for_u *)
                                  ((ulong)unaff_R14 & 0xffffffff00000000 | (ulong)MVar35);
                      *(undefined1 (*) [32])(paVar44 + 6) = auVar7;
                      *(undefined1 (*) [32])(paVar44 + 4) = auVar6;
                      paVar44[3].func = (MIR_func_t)unaff_R14;
                      in_ZMM1 = ZEXT1664(auVar7._0_16_);
                      paVar50 = (anon_union_8_10_166bea1d_for_u *)ctx;
                      remove_insn(ctx,pMVar76,(MIR_insn_t_conflict)before,
                                  &((pMVar76->u).func)->insns);
                      iVar72 = 0;
                    }
LAB_00134749:
                  } while (paVar44 != (anon_union_8_10_166bea1d_for_u *)0x0);
                  pVVar63 = ctx->simplify_ctx->temp_insns;
                  if (pVVar63 == (VARR_MIR_insn_t *)0x0) goto LAB_00136f60;
                }
                sVar64 = pVVar63->els_num;
                if (sVar64 != 0) {
                  if (pVVar63->varr == (MIR_insn_t_conflict *)0x0) goto LAB_00136f58;
                  pVVar11 = ctx->temp_ops;
                  if ((pVVar11 == (VARR_MIR_op_t *)0x0) || (pVVar11->varr == (MIR_op_t *)0x0)) {
                    MIR_link_cold_31();
                    goto LAB_00136eb6;
                  }
                  pMVar54 = (pMVar76->u).func;
                  paVar44 = (anon_union_8_10_166bea1d_for_u *)pVVar63->varr[sVar64 - 1];
                  pMVar12 = pMVar54->res_types;
                  pVVar11->els_num = 0;
                  if (sVar64 == 1) {
                    local_658 = (anon_union_8_10_166bea1d_for_u *)0x0;
                  }
                  else {
                    sVar64 = ctx->curr_label_num + 1;
                    ctx->curr_label_num = sVar64;
                    in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
                    local_658 = (anon_union_8_10_166bea1d_for_u *)create_label(ctx,sVar64);
                    paVar50 = (anon_union_8_10_166bea1d_for_u *)ctx;
                    MIR_insert_insn_before
                              (ctx,pMVar76,(MIR_insn_t_conflict)paVar44,
                               (MIR_insn_t_conflict)local_658);
                  }
                  unaff_R14 = paVar44;
                  if (pMVar54->nres != 0) {
                    unaff_R14 = (anon_union_8_10_166bea1d_for_u *)0x0;
                    unaff_R13 = paVar44 + 4;
                    local_678 = (MIR_func_t)((ulong)paVar44 & 0xffffffff);
                    do {
                      local_5e8.func = *(MIR_func_t *)unaff_R13;
                      aStack_5e0._16_8_ = unaff_R13[3].func;
                      aStack_5e0.mem.disp = (MIR_disp_t)unaff_R13[4].func;
                      local_5c0 = unaff_R13[5].func;
                      aStack_5e0.reg._0_2_ = SUB82(unaff_R13[1],0);
                      aStack_5e0.i._2_6_ = SUB86(unaff_R13[1],2);
                      aStack_5e0.mem.nonalias = SUB84(unaff_R13[2],0);
                      aStack_5e0.mem.nloc = SUB84(unaff_R13[2],4);
                      local_4f8 = (anon_union_8_10_166bea1d_for_u)unaff_R13->func;
                      aVar20 = unaff_R13[1];
                      pMStack_4e0 = unaff_R13[3].func;
                      pMStack_4d8 = unaff_R13[4].func;
                      pMStack_4d0 = unaff_R13[5].func;
                      uStack_4f0 = aVar20._0_1_;
                      uStack_4ef = aVar20._1_1_;
                      uStack_4ee = aVar20._2_6_;
                      MStack_4e8 = SUB84(unaff_R13[2],0);
                      uStack_4e4 = SUB84(unaff_R13[2],4);
                      paVar39 = (anon_union_8_10_166bea1d_for_u *)pVVar11->varr;
                      if (paVar39 == (anon_union_8_10_166bea1d_for_u *)0x0) goto LAB_00136ddf;
                      sVar64 = pVVar11->els_num;
                      uVar65 = sVar64 + 1;
                      if (pVVar11->size < uVar65) {
                        sVar64 = (uVar65 >> 1) + uVar65;
                        paVar50 = paVar39;
                        paVar39 = (anon_union_8_10_166bea1d_for_u *)realloc(paVar39,sVar64 * 0x30);
                        pVVar11->varr = (MIR_op_t *)paVar39;
                        pVVar11->size = sVar64;
                        sVar64 = pVVar11->els_num;
                        uVar65 = sVar64 + 1;
                      }
                      pVVar11->els_num = uVar65;
                      auVar23[8] = uStack_4f0;
                      auVar23._0_8_ = local_4f8.func;
                      auVar23[9] = uStack_4ef;
                      auVar23._10_6_ = uStack_4ee;
                      auVar23._16_4_ = MStack_4e8;
                      auVar23._20_4_ = uStack_4e4;
                      auVar23._24_8_ = pMStack_4e0;
                      auVar8._4_4_ = uStack_4e4;
                      auVar8._0_4_ = MStack_4e8;
                      auVar8._8_8_ = pMStack_4e0;
                      auVar8._16_8_ = pMStack_4d8;
                      auVar8._24_8_ = pMStack_4d0;
                      *(undefined1 (*) [32])(paVar39 + sVar64 * 6 + 2) = auVar8;
                      *(undefined1 (*) [32])(paVar39 + sVar64 * 6) = auVar23;
                      uVar65 = (ulong)pMVar12[(long)unaff_R14];
                      if (uVar65 < 6) {
                        MVar71 = *(MIR_insn_code_t *)(&DAT_001acb88 + uVar65 * 4);
                        aStack_5e0.mem.nonalias = new_temp_reg(ctx,MIR_T_I64,pMVar54);
                        local_5e8.func = (MIR_func_t)0x0;
                        uVar52 = ((uint)local_678 & 0xffffff00) + 1;
                        aStack_5e0.reg._0_2_ = (undefined2)uVar52;
                        local_678 = (MIR_func_t)(ulong)uVar52;
                        in_stack_fffffffffffff8e0 =
                             (int)CONCAT62(aStack_5e0.i._2_6_,aStack_5e0.reg._0_2_);
                        pMVar51 = MIR_new_insn(ctx,MVar71);
                        paVar50 = (anon_union_8_10_166bea1d_for_u *)ctx;
                        MIR_insert_insn_before(ctx,pMVar76,(MIR_insn_t_conflict)paVar44,pMVar51);
                        auVar21._8_2_ = aStack_5e0.reg._0_2_;
                        auVar21._0_8_ = local_5e8.func;
                        auVar21._10_6_ = aStack_5e0.i._2_6_;
                        auVar21._16_4_ = aStack_5e0.mem.nonalias;
                        auVar21._20_4_ = aStack_5e0.mem.nloc;
                        auVar21._24_8_ = aStack_5e0._16_8_;
                        auVar8._4_4_ = aStack_5e0.mem.nloc;
                        auVar8._0_4_ = aStack_5e0.mem.nonalias;
                        auVar8._8_8_ = aStack_5e0._16_8_;
                        auVar8._16_8_ = aStack_5e0.mem.disp;
                        auVar8._24_8_ = local_5c0;
                        *(undefined1 (*) [32])(unaff_R13 + 2) = auVar8;
                        *(undefined1 (*) [32])unaff_R13 = auVar21;
                      }
                      in_ZMM1 = ZEXT3264(auVar8);
                      unaff_R14 = (anon_union_8_10_166bea1d_for_u *)((long)unaff_R14 + 1);
                      unaff_R13 = unaff_R13 + 6;
                    } while (unaff_R14 < (anon_union_8_10_166bea1d_for_u *)(ulong)pMVar54->nres);
                  }
                  paVar39 = (anon_union_8_10_166bea1d_for_u *)pVVar63->els_num;
                  if (paVar39 != (anon_union_8_10_166bea1d_for_u *)0x0) {
                    unaff_R13 = (anon_union_8_10_166bea1d_for_u *)0x0;
                    do {
                      if (pVVar63->varr == (MIR_insn_t_conflict *)0x0) goto LAB_00136de7;
                      unaff_R14 = (anon_union_8_10_166bea1d_for_u *)pVVar63->varr[(long)unaff_R13];
                      if (unaff_R14 != paVar44) {
                        if ((SUB84(unaff_R14[3],0) != 0xab) &&
                           (SUB84(unaff_R14[3],4) != pMVar54->nres)) {
                          __assert_fail("insn->code == MIR_RET || func->nres == MIR_insn_nops (ctx, insn)"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                        ,0xde6,"void make_one_ret(MIR_context_t, MIR_item_t)");
                        }
                        if (pMVar54->nres != 0) {
                          lVar62 = 0x20;
                          uVar65 = 0;
                          do {
                            MVar67 = pMVar12[uVar65];
                            if (MVar67 == MIR_T_F) {
                              MVar71 = MIR_FMOV;
                            }
                            else if (MVar67 == MIR_T_D) {
                              MVar71 = MIR_DMOV;
                            }
                            else {
                              MVar71 = (uint)(MVar67 == MIR_T_LD) * 3;
                            }
                            local_578.data = *(void **)((long)unaff_R14 + lVar62);
                            local_578.module =
                                 (MIR_module_t)((undefined8 *)((long)unaff_R14 + lVar62))[1];
                            puVar1 = (undefined8 *)((long)unaff_R14 + lVar62 + 0x10);
                            local_578.item_link.prev = (MIR_item_t)*puVar1;
                            local_578.item_link.next = (MIR_item_t)puVar1[1];
                            local_578._32_8_ = puVar1[2];
                            local_578.ref_def = (MIR_item_t)puVar1[3];
                            if ((char)local_578.module != '\x01') goto LAB_00136d84;
                            pMVar13 = pVVar11->varr;
                            if ((pMVar13 == (MIR_op_t *)0x0) || (pVVar11->els_num <= uVar65)) {
                              MIR_link_cold_29();
LAB_00136d60:
                              __assert_fail("label->code == MIR_LABEL",
                                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                            ,0xe36,"MIR_insn_t last_label(MIR_label_t)");
                            }
                            aStack_5e0.mem.disp = *(undefined8 *)((long)&pMVar13->data + lVar62);
                            paVar50 = (anon_union_8_10_166bea1d_for_u *)
                                      ((long)pMVar13 + lVar62 + -0x20);
                            local_5e8 = *paVar50;
                            aStack_5e0._16_8_ = paVar50[3];
                            local_5c0 = *(MIR_func_t *)(&pMVar13->field_0x8 + lVar62);
                            aStack_5e0.reg._0_2_ = SUB82(paVar50[1],0);
                            aStack_5e0.i._2_6_ = SUB86(paVar50[1],2);
                            aStack_5e0.mem.nonalias = SUB84(paVar50[2],0);
                            aStack_5e0.mem.nloc = SUB84(paVar50[2],4);
                            pMVar51 = MIR_new_insn(ctx,MVar71);
                            MIR_insert_insn_before
                                      (ctx,pMVar76,(MIR_insn_t_conflict)unaff_R14,pMVar51);
                            uVar65 = uVar65 + 1;
                            lVar62 = lVar62 + 0x30;
                          } while (uVar65 < pMVar54->nres);
                        }
                        uStack_520 = 0xc;
                        local_528 = 0;
                        MStack_518 = (MIR_reg_t)local_658;
                        uStack_514 = (undefined4)((ulong)local_658 >> 0x20);
                        auVar22[9] = uStack_51f;
                        auVar22._0_9_ = (unkuint9)0xc << 0x40;
                        auVar22._10_6_ = uStack_51e;
                        in_stack_fffffffffffff8e0 = auVar22._8_4_;
                        in_ZMM1 = ZEXT1664(CONCAT88(uStack_510,local_658));
                        pMVar51 = MIR_new_insn(ctx,MIR_JMP);
                        MIR_insert_insn_before(ctx,pMVar76,(MIR_insn_t_conflict)unaff_R14,pMVar51);
                        paVar50 = (anon_union_8_10_166bea1d_for_u *)ctx;
                        remove_insn(ctx,pMVar76,(MIR_insn_t_conflict)unaff_R14,
                                    &((pMVar76->u).func)->insns);
                        paVar39 = (anon_union_8_10_166bea1d_for_u *)pVVar63->els_num;
                      }
                      unaff_R13 = (anon_union_8_10_166bea1d_for_u *)((long)unaff_R13 + 1);
                    } while (unaff_R13 < paVar39);
                  }
                }
                for (pMVar14 = pMVar41->first_lref; pMVar14 != (MIR_lref_data *)0x0;
                    pMVar14 = pMVar14->next) {
                  in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
                  paVar50 = (anon_union_8_10_166bea1d_for_u *)ctx;
                  mark_used_label(ctx,pMVar14->label->ops[0].u.label);
                  if (pMVar14->label2 != (MIR_label_t)0x0) {
                    paVar50 = (anon_union_8_10_166bea1d_for_u *)ctx;
                    mark_used_label(ctx,pMVar14->label2->ops[0].u.label);
                  }
                }
                psVar40 = ctx->simplify_ctx;
                pVVar55 = psVar40->labels;
                unaff_R13 = (anon_union_8_10_166bea1d_for_u *)ctx;
                local_658 = unaff_R14;
                if (pVVar55 != (VARR_MIR_insn_t *)0x0) {
                  uVar65 = 0;
                  while (ppMVar37 = pVVar55->varr, uVar65 < pVVar55->els_num) {
                    if (ppMVar37 == (MIR_insn_t_conflict *)0x0) goto LAB_00136dc5;
                    pVVar10 = ctx->used_label_p;
                    if (pVVar10 == (VARR_uint8_t *)0x0) goto LAB_00136dbd;
                    pMVar51 = ppMVar37[uVar65];
                    paVar50 = (anon_union_8_10_166bea1d_for_u *)pVVar10->els_num;
                    paVar44 = (anon_union_8_10_166bea1d_for_u *)pMVar51->ops[0].u.ref;
                    if ((long)paVar44 < (long)paVar50) {
                      if ((pVVar10->varr == (uint8_t *)0x0) || (paVar50 <= paVar44))
                      goto LAB_00136dd2;
                      if (pVVar10->varr[(long)paVar44] == '\0') goto LAB_00134fa5;
                      pMVar56 = (MIR_item_t)psVar40->new_label_num;
                      uVar52 = (uint)pVVar63 & 0xffffff00 | 3;
                      pVVar63 = (VARR_MIR_insn_t *)(ulong)uVar52;
                      psVar40->new_label_num = (size_t)((long)&pMVar56->data + 1);
                      pMVar51->ops[0].data = (void *)0x0;
                      *(short *)&pMVar51->ops[0].field_0x8 = (short)uVar52;
                      pMVar51->ops[0].u.ref = pMVar56;
                    }
                    else {
LAB_00134fa5:
                      in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
                      paVar50 = (anon_union_8_10_166bea1d_for_u *)ctx;
                      remove_insn(ctx,pMVar76,pMVar51,&((pMVar76->u).func)->insns);
                    }
                    psVar40 = ctx->simplify_ctx;
                    uVar65 = uVar65 + 1;
                    pVVar55 = psVar40->labels;
                    if (pVVar55 == (VARR_MIR_insn_t *)0x0) goto LAB_00136db0;
                  }
                  if (ppMVar37 != (MIR_insn_t_conflict *)0x0) {
                    pVVar55->els_num = 0;
                    import_resolver = (_func_void_ptr_char_ptr *)local_610._32_8_;
                    if (bVar30) {
                      pMVar76->data = (void *)0x1;
                    }
                    goto switchD_00133c6c_caseD_1;
                  }
                  goto LAB_00136f2c;
                }
                goto LAB_00136db0;
              }
            }
            MIR_link_cold_38();
            goto LAB_00136e8c;
          default:
            goto switchD_00133c6c_caseD_1;
          case MIR_import_item:
            local_4f8 = pMVar76->u;
            paVar50 = (anon_union_8_10_166bea1d_for_u *)ctx->module_item_tab;
            local_578._32_8_ = (ulong)(uint)local_578._36_4_ << 0x20;
            local_578.module = (MIR_module_t)local_618;
            local_578.u.func = (MIR_func_t)&local_4f8;
            in_ZMM1 = ZEXT1664(auVar78);
            iVar72 = HTAB_MIR_item_t_do((HTAB_MIR_item_t *)paVar50,&local_578,HTAB_FIND,
                                        (MIR_item_t_conflict *)&local_5e8.func);
            if (local_5e8.func == (MIR_func_t)0x0 || iVar72 == 0) {
              if ((import_resolver == (_func_void_ptr_char_ptr *)0x0) ||
                 (pvVar38 = (*import_resolver)((pMVar76->u).import_id), pvVar38 == (void *)0x0)) {
                unaff_R14 = (anon_union_8_10_166bea1d_for_u *)(pMVar76->u).func;
                pcVar70 = "import of undefined item %s";
                goto LAB_00136f21;
              }
              MIR_load_external(ctx,(pMVar76->u).import_id,pvVar38);
              local_4f8 = pMVar76->u;
              paVar50 = (anon_union_8_10_166bea1d_for_u *)ctx->module_item_tab;
              local_578._32_8_ = local_578._32_8_ & 0xffffffff00000000;
              local_578.module = (MIR_module_t)local_618;
              local_578.u.func = (MIR_func_t)&local_4f8;
              iVar72 = HTAB_MIR_item_t_do((HTAB_MIR_item_t *)paVar50,&local_578,HTAB_FIND,
                                          (MIR_item_t_conflict *)&local_5e8.func);
              if ((iVar72 == 0) || (local_5e8.func == (MIR_func_t)0x0)) goto LAB_00136f7d;
            }
            break;
          case MIR_export_item:
            local_4f8 = pMVar76->u;
            paVar50 = (anon_union_8_10_166bea1d_for_u *)ctx->module_item_tab;
            local_578._32_8_ = (ulong)(uint)local_578._36_4_ << 0x20;
            local_578.u.func = (MIR_func_t)&local_4f8;
            in_ZMM1 = ZEXT1664(auVar78);
            local_578.module = (MIR_module_t)pMVar75;
            iVar72 = HTAB_MIR_item_t_do((HTAB_MIR_item_t *)paVar50,&local_578,HTAB_FIND,
                                        (MIR_item_t_conflict *)&local_5e8.func);
            if ((iVar72 == 0) || (local_5e8.func == (MIR_func_t)0x0)) {
              unaff_R14 = (anon_union_8_10_166bea1d_for_u *)(pMVar76->u).func;
              pcVar70 = "export of undefined item %s";
LAB_00136f21:
              uVar73 = 0x14;
              goto LAB_00136f26;
            }
            break;
          case MIR_forward_item:
            local_4f8 = pMVar76->u;
            paVar50 = (anon_union_8_10_166bea1d_for_u *)ctx->module_item_tab;
            local_578._32_8_ = (ulong)(uint)local_578._36_4_ << 0x20;
            local_578.u.func = (MIR_func_t)&local_4f8;
            in_ZMM1 = ZEXT1664(auVar78);
            local_578.module = (MIR_module_t)pMVar75;
            iVar72 = HTAB_MIR_item_t_do((HTAB_MIR_item_t *)paVar50,&local_578,HTAB_FIND,
                                        (MIR_item_t_conflict *)&local_5e8.func);
            if ((iVar72 == 0) || (local_5e8.func == (MIR_func_t)0x0)) {
              unaff_R14 = (anon_union_8_10_166bea1d_for_u *)(pMVar76->u).func;
              pcVar70 = "forward of undefined item %s";
              goto LAB_00136f21;
            }
          }
          pMVar76->addr = ((local_5e8.func)->original_insns).tail;
          pMVar76->ref_def = (MIR_item_t)local_5e8;
switchD_00133c6c_caseD_1:
          pMVar76 = (pMVar76->item_link).next;
        } while (pMVar76 != (MIR_item_t)0x0);
        pMVar41 = (MIR_func_t)ctx->modules_to_link;
      }
      auVar78 = in_ZMM1._0_16_;
      pMVar48 = (MIR_insn_t)((long)(void **)local_610._8_8_ + 1);
      unaff_R13 = (anon_union_8_10_166bea1d_for_u *)ctx;
    } while (pMVar41 != (MIR_func_t)0x0);
  }
  in_ZMM1 = ZEXT1664(auVar78);
  MIR_link_cold_42();
  pMVar41 = extraout_RAX;
LAB_00135034:
  pMVar59 = (MIR_module_t_conflict)0x0;
  do {
    pMVar58 = (MIR_module_t_conflict)pMVar41->name;
    if (pMVar58 <= pMVar59) goto LAB_00136ccd;
    if ((MIR_module_t_conflict *)pMVar41->original_vars_num == (MIR_module_t_conflict *)0x0) {
LAB_00136fe7:
      MIR_link_cold_23();
LAB_00136fef:
      __assert_fail("called_func->nres == actual_nops",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x1028,"void process_inlines(MIR_context_t, MIR_item_t)");
    }
    pMVar58 = ((MIR_module_t_conflict *)pMVar41->original_vars_num)[(long)pMVar59];
    pMVar54 = (MIR_func_t)(pMVar58->items).head;
    paVar44 = paVar50;
    if (pMVar54 != (MIR_func_t)0x0) {
      do {
        iVar72 = *(int *)&(pMVar54->insns).tail;
        paVar44 = paVar50;
        if (iVar72 == 6) {
          pMVar15 = ((anon_union_8_10_166bea1d_for_u *)&pMVar54->last_temp_num)->lref_data;
          pMVar75 = pMVar15->label->ops[0].u.ref;
          if (pMVar75 == (MIR_item_t)0x0) {
LAB_00136e8c:
            __assert_fail("item->u.ref_data->ref_item->addr != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                          ,0x7d8,
                          "void MIR_link(MIR_context_t, void (*)(MIR_context_t, MIR_item_t), void *(*)(const char *))"
                         );
          }
          pMVar58 = (MIR_module_t_conflict)
                    ((long)&pMVar15->label2->ops[0].data + (long)&pMVar75[-1].ref_def);
          pMVar15->orig_label->data = pMVar58;
        }
        else if (iVar72 == 0) {
          if (pMVar54->name != (char *)0x0) {
            in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
            HTAB_val_t_clear((HTAB_val_t *)(unaff_R13[0x1b].func)->name);
            pMVar41 = ((anon_union_8_10_166bea1d_for_u *)&pMVar54->last_temp_num)->func;
            uVar65 = 0;
            for (pMVar51 = (pMVar41->insns).head; pMVar51 != (MIR_insn_t_conflict)0x0;
                pMVar51 = (pMVar51->insn_link).next) {
              uVar65 = uVar65 + 1;
            }
            paVar50 = unaff_R13;
            local_658 = (anon_union_8_10_166bea1d_for_u *)
                        func_alloca_features
                                  ((MIR_context_t)unaff_R13,pMVar41,&local_624,(int *)0x0,
                                   (int64_t *)local_610);
            if (local_624 != 0 && local_658 == (anon_union_8_10_166bea1d_for_u *)0x0) {
LAB_00136eb6:
              __assert_fail("func_top_alloca != ((void*)0) || !func_top_alloca_used_p",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                            ,0xfa2,"void process_inlines(MIR_context_t, MIR_item_t)");
            }
            if (local_658 == (anon_union_8_10_166bea1d_for_u *)0x0 || local_624 == 0) {
              local_618 = (MIR_item_t)0x0;
              local_680 = (MIR_item_t)0x0;
            }
            else {
              pMVar75 = (MIR_item_t)&DAT_00000001;
              if (1 < (long)local_610._0_8_) {
                pMVar75 = (MIR_item_t)local_610._0_8_;
              }
              local_618 = (MIR_item_t)((ulong)((MIR_item_t)0x8 < (ulong)local_610._0_8_) * 8 + 8);
              if ((ulong)local_610._0_8_ < (MIR_item_t)0x5) {
                local_618 = (MIR_item_t)0x4;
              }
              if ((long)local_610._0_8_ < 3) {
                local_618 = pMVar75;
              }
              puVar3 = (undefined1 *)((long)&pMVar75[-1].u + 7) + (long)local_618;
              local_680 = (MIR_item_t)(puVar3 + -((long)puVar3 % (long)local_618));
            }
            pMVar42 = unaff_R13[0x1b].func;
            pMVar51 = (pMVar42->original_insns).head;
            if ((pMVar51 == (MIR_insn_t_conflict)0x0) ||
               ((pMVar51->insn_link).next == (MIR_insn_t)0x0)) {
LAB_00136e59:
              MIR_link_cold_21();
            }
            else {
              pMVar51->data = (void *)0x0;
              pMVar47 = (pMVar42->original_insns).tail;
              if ((pMVar47 == (MIR_insn_t_conflict)0x0) ||
                 ((pMVar47->insn_link).next == (MIR_insn_t)0x0)) {
                MIR_link_cold_20();
                goto LAB_00136e59;
              }
              pMVar47->data = (void *)0x0;
              pVVar63 = (VARR_MIR_insn_t *)pMVar42->original_vars_num;
              if ((pVVar63 != (VARR_MIR_insn_t *)0x0) &&
                 (pVVar63->varr != (MIR_insn_t_conflict *)0x0)) {
                pVVar63->els_num = 0;
                unaff_R14 = (anon_union_8_10_166bea1d_for_u *)(pMVar41->insns).head;
                if (unaff_R14 == (anon_union_8_10_166bea1d_for_u *)0x0) {
                  local_630 = local_680;
                }
                else {
                  local_660 = (anon_union_8_10_166bea1d_for_u *)0x0;
                  local_3d0 = (uVar65 * 0x32) / 100;
                  if (local_3d0 < 0xc9) {
                    local_3d0 = 200;
                  }
                  local_630 = local_680;
                  local_628 = (uint)local_680;
                  local_610._32_4_ = local_628;
                  local_610._8_4_ = local_628;
                  pMVar75 = local_680;
                  local_638 = unaff_R14;
                  do {
                    pMVar42 = unaff_R13[0x1b].func;
                    auVar78 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
                    in_ZMM1 = ZEXT1664(auVar78);
                    auVar4._0_8_ = pMVar42->res_types;
                    auVar4[8] = pMVar42->vararg_p;
                    auVar4[9] = pMVar42->expr_p;
                    auVar4[10] = pMVar42->jret_p;
                    auVar4._11_5_ = *(undefined5 *)&pMVar42->field_0x53;
                    auVar78 = vpsubq_avx(auVar4,auVar78);
                    pMVar42->res_types = (MIR_type_t *)auVar78._0_8_;
                    pMVar42->vararg_p = auVar78[8];
                    pMVar42->expr_p = auVar78[9];
                    pMVar42->jret_p = auVar78[10];
                    *(int5 *)&pMVar42->field_0x53 = auVar78._11_5_;
                    pMVar51 = (pMVar42->original_insns).head;
                    if (pMVar51 == (MIR_insn_t_conflict)0x0) goto LAB_00136dcd;
                    pvVar38 = pMVar51->data;
                    if (pvVar38 != (void *)0x0) {
                      pMVar48 = (pMVar51->insn_link).next;
                      if (pMVar48 == (MIR_insn_t)0x0) goto LAB_00136dda;
                      if (*(anon_union_8_10_166bea1d_for_u **)
                           ((long)pMVar48->ops + (long)pvVar38 * 8 + -0x28) == unaff_R14) {
                        paVar50 = (anon_union_8_10_166bea1d_for_u *)(pMVar42->original_insns).tail;
                        do {
                          pvVar60 = (void *)((long)pvVar38 - 1);
                          pMVar51->data = pvVar60;
                          if (((paVar50 == (anon_union_8_10_166bea1d_for_u *)0x0) ||
                              ((MIR_error_func_t)paVar50[2].import_id == (MIR_error_func_t)0x0)) ||
                             (pMVar68 = paVar50->func, pMVar68 == (MIR_func_t)0x0)) {
                            MIR_link_cold_3();
LAB_00136d84:
                            __assert_fail("reg_op.mode == MIR_OP_REG",
                                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                          ,0xdea,"void make_one_ret(MIR_context_t, MIR_item_t)");
                          }
                          paVar50->func = (MIR_func_t)((long)&pMVar68[-1].first_lref + 7);
                          pMVar75 = *(MIR_item_t *)(paVar50[2].import_id + (long)pMVar68 * 8 + -8);
                        } while ((pvVar60 != (void *)0x0) &&
                                (lVar62 = (long)pvVar38 * 8, pvVar38 = pvVar60,
                                *(anon_union_8_10_166bea1d_for_u **)
                                 ((long)(pMVar48->ops + -1) + lVar62) == unaff_R14));
                      }
                    }
                    paVar44 = (anon_union_8_10_166bea1d_for_u *)unaff_R14[2].func;
                    MVar71 = *(MIR_insn_code_t *)(unaff_R14 + 3);
                    if (MVar71 == MIR_LABEL) {
                      pMVar68 = *(MIR_func_t *)&pMVar42->nres;
                      *(undefined1 **)&pMVar42->nres = (undefined1 *)((long)&pMVar68->name + 1);
                      unaff_R14[6].func = pMVar68;
                      MVar71 = *(MIR_insn_code_t *)(unaff_R14 + 3);
                    }
                    if (0xfffffffc < MVar71 - MIR_SWITCH) {
                      if (*(char *)(unaff_R14 + 0xb) == '\b') {
                        pMVar42 = unaff_R14[0xc].func;
LAB_00135358:
                        if (pMVar42 != (MIR_func_t)0x0) {
                          iVar72 = *(int *)&(pMVar42->insns).tail;
                          if (iVar72 - 2U < 3) goto code_r0x00135368;
                          if (pMVar42 != pMVar54 && iVar72 == 0) {
                            pMVar42 = ((anon_union_8_10_166bea1d_for_u *)&pMVar42->last_temp_num)->
                                      func;
                            uVar61 = 0;
                            for (pMVar51 = (pMVar42->insns).head;
                                pMVar51 != (MIR_insn_t_conflict)0x0;
                                pMVar51 = (pMVar51->insn_link).next) {
                              uVar61 = uVar61 + 1;
                            }
                            unaff_R13 = local_698;
                            if (((pMVar42->first_lref != (MIR_lref_data *)0x0) ||
                                (pMVar42->vararg_p != '\0')) || (pMVar42->jret_p != '\0'))
                            goto LAB_001353c3;
                            uVar43 = 200;
                            if (MVar71 == MIR_CALL) {
                              uVar43 = 0x32;
                            }
                            if ((uVar43 < uVar61) || (local_3d0 < uVar65)) goto LAB_001353c3;
                            *(long *)&(local_698[0x1b].func)->last_temp_num =
                                 *(long *)&(local_698[0x1b].func)->last_temp_num + 1;
                            local_3f8 = unaff_R14[1];
                            local_3f0 = *(int **)(*(long *)&(unaff_R14[6].func)->last_temp_num +
                                                 0x10);
                            local_590 = uVar65;
                            local_400 = uVar61;
                            if (paVar44 == (anon_union_8_10_166bea1d_for_u *)0x0) {
                              pMVar68 = (MIR_func_t)((long)&(local_698[0x13].func)->name + 1);
                              local_698[0x13].func = pMVar68;
                              paVar44 = (anon_union_8_10_166bea1d_for_u *)
                                        create_label((MIR_context_t)local_698,(int64_t)pMVar68);
                              MIR_insert_insn_after
                                        ((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54,
                                         (MIR_insn_t_conflict)unaff_R14,(MIR_insn_t_conflict)paVar44
                                        );
                            }
                            pMVar41->n_inlines = pMVar41->n_inlines + 1;
                            pVVar16 = pMVar42->vars;
                            if (pVVar16 == (VARR_MIR_var_t *)0x0) goto LAB_0013708a;
                            rename_regs((MIR_context_t)local_698,pMVar41,pMVar42,pVVar16,
                                        pVVar16->els_num);
                            pVVar16 = pMVar42->global_vars;
                            if (pVVar16 != (VARR_MIR_var_t *)0x0) {
                              rename_regs((MIR_context_t)local_698,pMVar41,pMVar42,pVVar16,
                                          pVVar16->els_num);
                            }
                            local_588 = (MIR_insn_t_conflict)(ulong)pMVar42->nargs;
                            if (local_588 != (MIR_insn_t_conflict)0x0) {
                              lVar62 = 0x10;
                              pMVar51 = (MIR_insn_t_conflict)0x0;
                              local_3d8 = (ulong)(pMVar42->nres + 2);
                              local_3e0 = unaff_R14 + local_3d8 * 6;
                              while( true ) {
                                if ((ulong)*(uint *)((long)unaff_R14 + 0x1c) <=
                                    (long)pMVar51->ops + (local_3d8 - 0x20)) goto LAB_00135f92;
                                puVar1 = (undefined8 *)((long)local_3e0 + lVar62 * 2);
                                local_338 = *puVar1;
                                uStack_330 = puVar1[1];
                                uStack_328 = puVar1[2];
                                uStack_320 = puVar1[3];
                                uStack_318 = *(undefined8 *)((long)local_3e0 + lVar62 * 2 + 0x20);
                                uStack_310 = *(undefined8 *)((long)local_3e0 + lVar62 * 2 + 0x28);
                                pVVar16 = pMVar42->vars;
                                if (((pVVar16 == (VARR_MIR_var_t *)0x0) ||
                                    (pMVar17 = pVVar16->varr, pMVar17 == (MIR_var_t *)0x0)) ||
                                   ((MIR_insn_t_conflict)pVVar16->els_num <= pMVar51))
                                goto LAB_00136f68;
                                uVar52 = *(uint *)((long)pMVar17 + lVar62 + -0x10);
                                ctx_00 = *(MIR_context_t *)((long)pMVar17 + lVar62 + -8);
                                lVar18 = *(long *)((long)&pMVar17->type + lVar62);
                                uVar53 = 6;
                                if ((uVar52 & 0xfffffffe) == 8) {
                                  uVar53 = uVar52;
                                }
                                if (uVar52 == 10) {
                                  uVar53 = uVar52;
                                }
                                prVar45 = find_rd_by_name(ctx_00,(char *)pMVar42->internal,
                                                          (MIR_func_t)(ulong)(uVar52 & 0xfffffffe));
                                if (prVar45 == (reg_desc_t *)0x0) {
                                  (*(code *)local_698[2])(0xf,"undeclared func reg %s",ctx_00);
                                  goto LAB_00137049;
                                }
                                pMVar19 = (local_698[0x1b].lref_data)->orig_label2;
                                if (((pMVar19 == (MIR_label_t)0x0) ||
                                    (pMVar48 = (pMVar19->insn_link).next, pMVar48 == (MIR_insn_t)0x0
                                    )) || (pMVar19->data <= (void *)(ulong)prVar45->reg)) break;
                                if (0xfffffff9 < uVar53 - 0x12) {
                                  __assert_fail("!MIR_all_blk_type_p (type) || (op.mode == MIR_OP_MEM && type == MIR_T_I64)"
                                                ,
                                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                                ,0xfea,
                                                "void process_inlines(MIR_context_t, MIR_item_t)");
                                }
                                uVar9 = *(undefined4 *)
                                         ((long)pMVar48->ops + (long)(ulong)prVar45->reg * 4 + -0x20
                                         );
                                if (uVar52 - 0x11 < 0xfffffffb) {
                                  if (uVar52 == 0x11) {
                                    local_338 = 0;
                                    local_628 = (local_628 & 0xffffff00) + 1;
                                    uStack_330 = CONCAT62(uStack_330._2_6_,(short)local_628);
                                    uStack_328 = CONCAT44(uStack_328._4_4_,(undefined4)uStack_318);
                                  }
                                  if (uVar53 == 8) {
                                    MVar71 = MIR_FMOV;
                                  }
                                  else if (uVar53 == 9) {
                                    MVar71 = MIR_DMOV;
                                  }
                                  else {
                                    MVar71 = (uint)(uVar53 == 10) * 3;
                                  }
                                  uStack_120 = 1;
                                  local_128 = 0;
                                  auVar28._9_7_ = uStack_11f;
                                  auVar28._0_9_ = (unkuint9)1 << 0x40;
                                  in_stack_fffffffffffff8e0 = auVar28._8_4_;
                                  in_ZMM1 = ZEXT1664(CONCAT124(auStack_114,uVar9));
                                  uStack_118 = uVar9;
                                  pMVar47 = MIR_new_insn((MIR_context_t)local_698,MVar71);
                                  MIR_insert_insn_before
                                            ((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54,
                                             (MIR_insn_t_conflict)paVar44,pMVar47);
                                }
                                else {
                                  local_620 = (MIR_insn_t_conflict)(local_698[0x1b].lref_data)->next
                                  ;
                                  local_f8 = 0;
                                  local_308 = 0;
                                  iVar72 = (local_610._32_4_ & 0xffffff00) + 1;
                                  iVar74 = (local_610._8_4_ & 0xffffff00) + 1;
                                  uStack_f0 = (undefined2)iVar74;
                                  uStack_300 = (undefined2)iVar72;
                                  local_610._32_4_ = iVar72;
                                  local_610._8_4_ = iVar74;
                                  uStack_e8 = (undefined4)uStack_318;
                                  uVar65 = lVar18 + 7;
                                  pMVar68 = ((anon_union_8_10_166bea1d_for_u *)
                                            &pMVar54->last_temp_num)->func;
                                  uStack_2f8 = uVar9;
                                  MStack_4e8 = new_temp_reg((MIR_context_t)local_698,MIR_T_I64,
                                                            pMVar68);
                                  uStack_4f0 = 1;
                                  uStack_4ef = 0;
                                  local_4f8.func = (MIR_func_t)0x0;
                                  local_578.item_link.prev =
                                       (MIR_item_t)(uVar65 & 0xfffffffffffffff8);
                                  local_578.module =
                                       (MIR_module_t)CONCAT62(local_578.module._2_6_,3);
                                  local_578.data = (void *)0x0;
                                  pMVar47 = MIR_new_insn((MIR_context_t)local_698,MIR_MOV);
                                  MIR_insert_insn_before
                                            ((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54,
                                             (MIR_insn_t_conflict)paVar44,pMVar47);
                                  auVar25._8_2_ = uStack_300;
                                  auVar25._0_8_ = local_308;
                                  auVar25._10_6_ = uStack_2fe;
                                  in_stack_fffffffffffff8e0 = auVar25._8_4_;
                                  in_ZMM1 = ZEXT1664(CONCAT88(uStack_2f0,
                                                              CONCAT44(uStack_2f4,uStack_2f8)));
                                  pMVar47 = MIR_new_insn((MIR_context_t)local_698,MIR_ALLOCA);
                                  MIR_insert_insn_before
                                            ((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54,
                                             (MIR_insn_t_conflict)paVar44,pMVar47);
                                  if ((uVar65 & 0xfffffffffffffff8) != 0) {
                                    local_610._20_4_ =
                                         new_temp_reg((MIR_context_t)local_698,MIR_T_I64,pMVar68);
                                    aStack_5e0.reg._0_2_ = 1;
                                    local_5e8.func = (MIR_func_t)0x0;
                                    aStack_5e0.mem.nonalias = local_610._20_4_;
                                    MStack_518 = new_temp_reg((MIR_context_t)local_698,MIR_T_I64,
                                                              pMVar68);
                                    uStack_520 = 1;
                                    uStack_51f = 0;
                                    local_528 = 0;
                                    MStack_428 = new_temp_reg((MIR_context_t)local_698,MIR_T_I64,
                                                              pMVar68);
                                    uStack_430 = 1;
                                    uStack_42f = 0;
                                    local_438 = 0;
                                    MStack_458 = new_temp_reg((MIR_context_t)local_698,MIR_T_I64,
                                                              pMVar68);
                                    pMVar47 = local_620;
                                    uStack_460 = 1;
                                    uStack_45f = 0;
                                    local_468 = 0;
                                    ppvVar32 = &local_620->data;
                                    pMVar46 = create_label((MIR_context_t)local_698,
                                                           (int64_t)local_620);
                                    local_620 = (MIR_insn_t_conflict)((long)&pMVar47->data + 2);
                                    pMVar47 = create_label((MIR_context_t)local_698,
                                                           (int64_t)((long)ppvVar32 + 1));
                                    uStack_360 = 3;
                                    uStack_35f = 0;
                                    local_368 = 0;
                                    paStack_358 = (anon_union_8_10_166bea1d_for_u *)0x0;
                                    local_3e8 = pMVar47;
                                    pMVar49 = MIR_new_insn((MIR_context_t)local_698,MIR_MOV);
                                    MIR_insert_insn_before
                                              ((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54
                                               ,(MIR_insn_t_conflict)paVar44,pMVar49);
                                    uStack_60 = 0xc;
                                    local_68 = 0;
                                    pMStack_58 = pMVar47;
                                    pMVar47 = MIR_new_insn((MIR_context_t)local_698,MIR_BLE);
                                    MIR_insert_insn_before
                                              ((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54
                                               ,(MIR_insn_t_conflict)paVar44,pMVar47);
                                    MIR_insert_insn_before
                                              ((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54
                                               ,(MIR_insn_t_conflict)paVar44,pMVar46);
                                    pMVar47 = MIR_new_insn((MIR_context_t)local_698,MIR_ADD);
                                    MIR_insert_insn_before
                                              ((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54
                                               ,(MIR_insn_t_conflict)paVar44,pMVar47);
                                    uStack_390 = 10;
                                    local_398 = 0;
                                    uStack_388 = 0x106;
                                    local_370 = 0;
                                    local_378 = local_610._20_4_;
                                    local_374 = 0;
                                    uStack_37c = 0;
                                    uStack_384 = 0;
                                    uStack_380 = 0;
                                    pMVar47 = MIR_new_insn((MIR_context_t)local_698,MIR_MOV);
                                    MIR_insert_insn_before
                                              ((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54
                                               ,(MIR_insn_t_conflict)paVar44,pMVar47);
                                    pMVar47 = MIR_new_insn((MIR_context_t)local_698,MIR_ADD);
                                    MIR_insert_insn_before
                                              ((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54
                                               ,(MIR_insn_t_conflict)paVar44,pMVar47);
                                    uStack_3c0 = 10;
                                    local_3c8 = 0;
                                    uStack_3b8 = 0x106;
                                    local_3a0 = 0;
                                    local_3a8 = local_610._20_4_;
                                    local_3a4 = 0;
                                    uStack_3ac = 0;
                                    uStack_3b4 = 0;
                                    uStack_3b0 = 0;
                                    pMVar47 = MIR_new_insn((MIR_context_t)local_698,MIR_MOV);
                                    MIR_insert_insn_before
                                              ((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54
                                               ,(MIR_insn_t_conflict)paVar44,pMVar47);
                                    uStack_90 = 3;
                                    local_98 = 0;
                                    uStack_88 = 8;
                                    pMVar47 = MIR_new_insn((MIR_context_t)local_698,MIR_MOV);
                                    MIR_insert_insn_before
                                              ((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54
                                               ,(MIR_insn_t_conflict)paVar44,pMVar47);
                                    pMVar47 = MIR_new_insn((MIR_context_t)local_698,MIR_ADD);
                                    MIR_insert_insn_before
                                              ((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54
                                               ,(MIR_insn_t_conflict)paVar44,pMVar47);
                                    uStack_c0 = 0xc;
                                    local_c8 = 0;
                                    auVar29._9_7_ = uStack_bf;
                                    auVar29._0_9_ = (unkuint9)0xc << 0x40;
                                    in_stack_fffffffffffff8e0 = auVar29._8_4_;
                                    in_ZMM1 = ZEXT1664(CONCAT88(uStack_b0,pMVar46));
                                    pMStack_b8 = pMVar46;
                                    pMVar47 = MIR_new_insn((MIR_context_t)local_698,MIR_BLT);
                                    MIR_insert_insn_before
                                              ((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54
                                               ,(MIR_insn_t_conflict)paVar44,pMVar47);
                                    MIR_insert_insn_before
                                              ((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54
                                               ,(MIR_insn_t_conflict)paVar44,local_3e8);
                                  }
                                  (local_698[0x1b].lref_data)->next = (MIR_lref_data *)local_620;
                                }
                                pMVar51 = (MIR_insn_t_conflict)((long)&pMVar51->data + 1);
                                lVar62 = lVar62 + 0x18;
                                if (local_588 == pMVar51) goto LAB_00135f92;
                              }
                              goto LAB_00136f70;
                            }
LAB_00135f92:
                            pMVar51 = ((local_698[0x1b].func)->original_insns).head;
                            pMVar48 = (pMVar51->insn_link).next;
                            if (pMVar48 != (MIR_insn_t)0x0) {
                              pvVar38 = pMVar51->data;
                              pMVar57 = (MIR_insn_t)((long)pvVar38 + 1);
                              if ((pMVar51->insn_link).prev < pMVar57) {
                                pMVar57 = (MIR_insn_t)
                                          ((long)pMVar57->ops + (((ulong)pMVar57 >> 1) - 0x20));
                                pMVar48 = (MIR_insn_t)realloc(pMVar48,(long)pMVar57 * 8);
                                (pMVar51->insn_link).next = pMVar48;
                                (pMVar51->insn_link).prev = pMVar57;
                                pvVar38 = pMVar51->data;
                                pMVar57 = (MIR_insn_t)((long)pvVar38 + 1);
                              }
                              pMVar51->data = pMVar57;
                              *(anon_union_8_10_166bea1d_for_u **)
                               ((long)pMVar48->ops + (long)pvVar38 * 8 + -0x20) = paVar44;
                              pMVar51 = ((local_698[0x1b].func)->original_insns).tail;
                              pMVar48 = (pMVar51->insn_link).next;
                              if (pMVar48 == (MIR_insn_t)0x0) goto LAB_00137094;
                              pvVar38 = pMVar51->data;
                              pMVar57 = (MIR_insn_t)((long)pvVar38 + 1);
                              if ((pMVar51->insn_link).prev < pMVar57) {
                                pMVar57 = (MIR_insn_t)
                                          ((long)pMVar57->ops + (((ulong)pMVar57 >> 1) - 0x20));
                                pMVar48 = (MIR_insn_t)realloc(pMVar48,(long)pMVar57 * 8);
                                (pMVar51->insn_link).next = pMVar48;
                                (pMVar51->insn_link).prev = pMVar57;
                                pvVar38 = pMVar51->data;
                                pMVar57 = (MIR_insn_t)((long)pvVar38 + 1);
                              }
                              pMVar51->data = pMVar57;
                              *(MIR_item_t *)((long)pMVar48->ops + (long)pvVar38 * 8 + -0x20) =
                                   pMVar75;
                              pMVar51 = (MIR_insn_t_conflict)local_610;
                              pMVar47 = func_alloca_features
                                                  ((MIR_context_t)local_698,pMVar42,
                                                   (int *)(local_610 + 0x18),
                                                   (int *)(local_610 + 0x1c),(int64_t *)pMVar51);
                              pVVar63 = extraout_RDX;
                              if ((pMVar47 != (MIR_insn_t_conflict)0x0) && (local_610._24_4_ != 0))
                              {
                                pMVar56 = (MIR_item_t)&DAT_00000001;
                                if (1 < (long)local_610._0_8_) {
                                  pMVar56 = (MIR_item_t)local_610._0_8_;
                                }
                                pMVar69 = (MIR_item_t)
                                          ((ulong)((MIR_item_t)0x8 < (ulong)local_610._0_8_) * 8 + 8
                                          );
                                if ((ulong)local_610._0_8_ < (MIR_item_t)0x5) {
                                  pMVar69 = (MIR_item_t)0x4;
                                }
                                if ((long)local_610._0_8_ < 3) {
                                  pMVar69 = pMVar56;
                                }
                                puVar3 = (undefined1 *)((long)&pMVar56[-1].u + 7) + (long)pMVar69;
                                pVVar63 = (VARR_MIR_insn_t *)((long)puVar3 % (long)pMVar69);
                                local_610._0_8_ = puVar3 + -(long)pVVar63;
                                if ((long)local_618 < (long)pMVar69) {
                                  puVar3 = (undefined1 *)((long)&pMVar69[-1].u + 7) + (long)pMVar75;
                                  pVVar63 = (VARR_MIR_insn_t *)((long)puVar3 % (long)pMVar69);
                                  pMVar75 = (MIR_item_t)(puVar3 + -(long)pVVar63);
                                  local_618 = pMVar69;
                                }
                                pMVar75 = (MIR_item_t)
                                          ((long)&((MIR_item_t)local_610._0_8_)->data +
                                          (long)&pMVar75->data);
                                if ((long)local_630 <= (long)pMVar75) {
                                  local_630 = pMVar75;
                                }
                              }
                              pMVar68 = local_698[0x1b].func;
                              pMVar56 = pMVar68->func_item;
                              if ((pMVar56 == (MIR_item_t)0x0) ||
                                 ((pMVar56->item_link).prev == (MIR_item_t)0x0)) goto LAB_0013707b;
                              pMVar56->data = (void *)0x0;
                              pMVar46 = (pMVar68->insns).head;
                              if ((pMVar46 == (MIR_insn_t_conflict)0x0) ||
                                 ((pMVar46->insn_link).next == (MIR_insn_t)0x0)) goto LAB_00137080;
                              pMVar46->data = (void *)0x0;
                              pMVar68 = local_698[7].func;
                              if ((pMVar68 != (MIR_func_t)0x0) && (pMVar68->original_vars_num != 0))
                              {
                                pMVar68->name = (char *)0x0;
                                if (local_610._28_4_ == 0) {
                                  pMVar46 = (pMVar42->insns).tail;
                                  while( true ) {
                                    if (pMVar46 == (MIR_insn_t_conflict)0x0) {
                                      __assert_fail("insn != ((void*)0)",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                                  ,0x1015,
                                                  "void process_inlines(MIR_context_t, MIR_item_t)")
                                      ;
                                    }
                                    if (*(int *)&pMVar46->field_0x18 - 0xabU < 2) {
                                      pMVar51 = (pMVar46->insn_link).next;
                                      goto LAB_001362a2;
                                    }
                                    *(long *)&(local_698[0x1b].func)->vararg_p =
                                         *(long *)&(local_698[0x1b].func)->vararg_p + 1;
                                    pMVar49 = MIR_copy_insn((MIR_context_t)local_698,pMVar46);
                                    change_inline_insn_regs((MIR_context_t)local_698,pMVar49);
                                    store_labels_for_duplication
                                              ((MIR_context_t)((local_698[0x1b].func)->insns).head,
                                               (VARR_MIR_insn_t *)(local_698[0x1b].func)->func_item,
                                               (VARR_MIR_insn_t *)pMVar46,pMVar49,pMVar51);
                                    pMVar19 = (local_698[0x1b].lref_data)->label2;
                                    pMVar48 = (pMVar19->insn_link).next;
                                    if (pMVar48 == (MIR_insn_t)0x0) break;
                                    pVVar63 = (VARR_MIR_insn_t *)pMVar19->data;
                                    pMVar57 = (MIR_insn_t)((long)&pVVar63->els_num + 1);
                                    if ((pMVar19->insn_link).prev < pMVar57) {
                                      pMVar57 = (MIR_insn_t)
                                                ((long)pMVar57->ops + (((ulong)pMVar57 >> 1) - 0x20)
                                                );
                                      pMVar48 = (MIR_insn_t)realloc(pMVar48,(long)pMVar57 * 8);
                                      (pMVar19->insn_link).next = pMVar48;
                                      (pMVar19->insn_link).prev = pMVar57;
                                      pVVar63 = (VARR_MIR_insn_t *)pMVar19->data;
                                      pMVar57 = (MIR_insn_t)((long)&pVVar63->els_num + 1);
                                    }
                                    pMVar19->data = pMVar57;
                                    *(MIR_insn_t_conflict *)
                                     ((long)pMVar48->ops + (long)pVVar63 * 8 + -0x20) = pMVar49;
                                    pMVar46 = (pMVar46->insn_link).prev;
                                  }
                                  goto LAB_00136fe2;
                                }
                                pMVar51 = (MIR_insn_t_conflict)0x0;
LAB_001362a2:
                                pMVar46 = (pMVar42->insns).head;
                                if (pMVar46 != pMVar51) {
                                  do {
                                    local_620 = pMVar51;
                                    if (*(int *)&pMVar46->field_0x18 == 0xac) {
                                      __assert_fail("insn->code != MIR_JRET",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                                  ,0x101a,
                                                  "void process_inlines(MIR_context_t, MIR_item_t)")
                                      ;
                                    }
                                    *(long *)&(local_698[0x1b].func)->vararg_p =
                                         *(long *)&(local_698[0x1b].func)->vararg_p + 1;
                                    paVar50 = (anon_union_8_10_166bea1d_for_u *)
                                              MIR_copy_insn((MIR_context_t)local_698,pMVar46);
                                    if (pMVar46 == pMVar47) {
                                      local_660 = paVar50;
                                    }
                                    change_inline_insn_regs
                                              ((MIR_context_t)local_698,(MIR_insn_t_conflict)paVar50
                                              );
                                    if (*(int *)(paVar50 + 3) == 0xab) {
                                      if ((((pMVar46->insn_link).next != local_620) ||
                                          (*(char *)(unaff_R14 + 5) != '\b')) ||
                                         (*(int *)&((unaff_R14[6].func)->insns).tail != 1))
                                      goto LAB_00136f34;
                                      uVar65 = *(ulong *)&pMVar46->field_0x18 >> 0x20;
                                      local_588 = pMVar46;
                                      if ((uint32_t)(*(ulong *)&pMVar46->field_0x18 >> 0x20) !=
                                          pMVar42->nres) goto LAB_00136fef;
                                      if (uVar65 != 0) {
                                        lVar62 = 0;
                                        piVar66 = local_3f0;
                                        do {
                                          if (*(char *)((long)paVar50 + lVar62 + 0x28) != '\x01')
                                          goto LAB_00136e35;
                                          iVar72 = *piVar66;
                                          if (iVar72 == 8) {
                                            MVar71 = MIR_FMOV;
                                          }
                                          else if (iVar72 == 9) {
                                            MVar71 = MIR_DMOV;
                                          }
                                          else {
                                            MVar71 = (uint)(iVar72 == 10) * 3;
                                          }
                                          uStack_148 = *(undefined4 *)
                                                        ((long)paVar50 + lVar62 + 0x30);
                                          uStack_150 = 1;
                                          local_158 = 0;
                                          in_stack_fffffffffffff8e0 =
                                               SUB324(*(undefined1 (*) [32])
                                                       ((long)unaff_R14 + lVar62 + 0x80),8);
                                          in_ZMM1 = ZEXT1664(SUB3216(*(undefined1 (*) [32])
                                                                      ((long)unaff_R14 +
                                                                      lVar62 + 0x90),0));
                                          pMVar51 = MIR_new_insn((MIR_context_t)local_698,MVar71);
                                          MIR_insert_insn_before
                                                    ((MIR_context_t)local_698,
                                                     (MIR_item_t_conflict)pMVar54,
                                                     (MIR_insn_t_conflict)paVar44,pMVar51);
                                          lVar62 = lVar62 + 0x30;
                                          piVar66 = piVar66 + 1;
                                        } while (uVar65 * 0x30 != lVar62);
                                      }
                                      free(paVar50);
                                      pVVar63 = extraout_RDX_00;
                                      pMVar46 = local_588;
                                    }
                                    else {
                                      paVar39 = paVar50;
                                      MIR_insert_insn_before
                                                ((MIR_context_t)local_698,
                                                 (MIR_item_t_conflict)pMVar54,
                                                 (MIR_insn_t_conflict)paVar44,
                                                 (MIR_insn_t_conflict)paVar50);
                                      store_labels_for_duplication
                                                ((MIR_context_t)((local_698[0x1b].func)->insns).head
                                                 ,(VARR_MIR_insn_t *)
                                                  (local_698[0x1b].func)->func_item,
                                                 (VARR_MIR_insn_t *)pMVar46,
                                                 (MIR_insn_t_conflict)paVar50,
                                                 (MIR_insn_t_conflict)paVar39);
                                      pVVar63 = extraout_RDX_01;
                                    }
                                    pMVar46 = (pMVar46->insn_link).next;
                                    pMVar51 = local_620;
                                  } while (pMVar46 != local_620);
                                }
                                redirect_duplicated_labels
                                          ((MIR_context_t)((local_698[0x1b].func)->insns).head,
                                           (VARR_MIR_insn_t *)(local_698[0x1b].func)->func_item,
                                           pVVar63);
                                if (local_610._28_4_ != 0) {
                                  MVar36 = new_temp_reg((MIR_context_t)local_698,MIR_T_I64,pMVar41);
                                  uStack_180 = 1;
                                  local_188 = 0;
                                  MStack_178 = MVar36;
                                  pMVar51 = MIR_new_insn((MIR_context_t)local_698,MIR_BSTART);
                                  MIR_insert_insn_after
                                            ((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54,
                                             (MIR_insn_t_conflict)unaff_R14,pMVar51);
                                  uStack_1b0 = 1;
                                  local_1b8 = 0;
                                  auVar27._9_7_ = uStack_1af;
                                  auVar27._0_9_ = (unkuint9)1 << 0x40;
                                  in_stack_fffffffffffff8e0 = auVar27._8_4_;
                                  in_ZMM1 = ZEXT1664(CONCAT124(auStack_1a4,MVar36));
                                  MStack_1a8 = MVar36;
                                  pMVar51 = MIR_new_insn((MIR_context_t)local_698,MIR_BEND);
                                  MIR_insert_insn_before
                                            ((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54,
                                             (MIR_insn_t_conflict)paVar44,pMVar51);
                                }
                                uVar65 = local_590;
                                if (pMVar47 != (MIR_insn_t_conflict)0x0) {
                                  if (local_610._24_4_ != 0) {
                                    local_624 = 1;
                                    if (local_658 == (anon_union_8_10_166bea1d_for_u *)0x0) {
                                      MVar36 = new_temp_reg((MIR_context_t)local_698,MIR_T_I64,
                                                            pMVar41);
                                      uStack_1e0 = 1;
                                      local_1e8 = 0;
                                      MStack_1d8 = MVar36;
                                      local_658 = (anon_union_8_10_166bea1d_for_u *)
                                                  MIR_new_insn((MIR_context_t)local_698,MIR_ALLOCA);
                                      if (*(int *)(local_638 + 3) == 0xb4) {
                                        MIR_insert_insn_after
                                                  ((MIR_context_t)local_698,
                                                   (MIR_item_t_conflict)pMVar54,
                                                   (MIR_insn_t_conflict)local_638,
                                                   (MIR_insn_t_conflict)local_658);
                                      }
                                      else {
                                        MIR_insert_insn_before
                                                  ((MIR_context_t)local_698,
                                                   (MIR_item_t_conflict)pMVar54,
                                                   (MIR_insn_t_conflict)local_638,
                                                   (MIR_insn_t_conflict)local_658);
                                      }
                                      uStack_210 = 1;
                                      local_218 = 0;
                                      uStack_240 = 3;
                                      local_248 = 0;
                                      uStack_238 = 0;
                                      MStack_208 = MVar36;
                                      pMVar51 = MIR_new_insn((MIR_context_t)local_698,MIR_MOV);
                                      MIR_insert_insn_before
                                                ((MIR_context_t)local_698,
                                                 (MIR_item_t_conflict)pMVar54,
                                                 (MIR_insn_t_conflict)local_658,pMVar51);
                                      local_680 = (MIR_item_t)0x0;
                                    }
                                    if (pMVar75 == (MIR_item_t)local_610._0_8_) {
                                      auVar5 = SUB3216(*(undefined1 (*) [32])(local_660 + 6),0);
                                      in_stack_fffffffffffff8e0 =
                                           SUB324(*(undefined1 (*) [32])(local_660 + 4),8);
                                    }
                                    else {
                                      MVar36 = new_temp_reg((MIR_context_t)local_698,MIR_T_I64,
                                                            pMVar41);
                                      uStack_270 = 1;
                                      local_278 = 0;
                                      MStack_268 = MVar36;
                                      pMVar51 = MIR_new_insn((MIR_context_t)local_698,MIR_ADD);
                                      MIR_insert_insn_after
                                                ((MIR_context_t)local_698,
                                                 (MIR_item_t_conflict)pMVar54,
                                                 (MIR_insn_t_conflict)unaff_R14,pMVar51);
                                      lStack_2c8 = (long)pMVar75 - local_610._0_8_;
                                      uStack_2a0 = 1;
                                      local_2a8 = 0;
                                      uStack_2d0 = 3;
                                      local_2d8 = 0;
                                      auVar26._9_7_ = uStack_29f;
                                      auVar26._0_9_ = (unkuint9)1 << 0x40;
                                      auVar5._4_12_ = auStack_294;
                                      auVar5._0_4_ = MVar36;
                                      in_stack_fffffffffffff8e0 = auVar26._8_4_;
                                      MStack_298 = MVar36;
                                    }
                                    in_ZMM1 = ZEXT1664(auVar5);
                                    pMVar51 = MIR_new_insn((MIR_context_t)local_698,MIR_MOV);
                                    MIR_insert_insn_after
                                              ((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54
                                               ,(MIR_insn_t_conflict)unaff_R14,pMVar51);
                                  }
                                  uVar65 = local_590;
                                  if (local_638 == local_660) {
                                    local_638 = (anon_union_8_10_166bea1d_for_u *)local_638[2].func;
                                  }
                                  remove_insn((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54,
                                              (MIR_insn_t_conflict)local_660,
                                              &((anon_union_8_10_166bea1d_for_u *)
                                               &pMVar54->last_temp_num)->func->insns);
                                }
                                if (local_638 == unaff_R14) {
                                  local_638 = (anon_union_8_10_166bea1d_for_u *)local_638[2].func;
                                }
                                paVar50 = local_698;
                                remove_insn((MIR_context_t)local_698,(MIR_item_t_conflict)pMVar54,
                                            (MIR_insn_t_conflict)unaff_R14,
                                            &((anon_union_8_10_166bea1d_for_u *)
                                             &pMVar54->last_temp_num)->func->insns);
                                if (local_638 == unaff_R14) {
                                  local_638 = (anon_union_8_10_166bea1d_for_u *)
                                              (pMVar41->insns).head;
                                }
                                uVar65 = uVar65 + local_400;
                                if (local_3f8.func == (MIR_func_t)0x0) {
                                  paVar44 = (anon_union_8_10_166bea1d_for_u *)(pMVar41->insns).head;
                                }
                                else {
                                  paVar44 = (anon_union_8_10_166bea1d_for_u *)
                                            (local_3f8.lref_data)->label2;
                                }
                                goto LAB_001353e0;
                              }
                              goto LAB_00137085;
                            }
                            goto LAB_0013708f;
                          }
                        }
                      }
LAB_001353c3:
                      paVar50 = unaff_R13;
                      simplify_op((MIR_context_t)unaff_R13,(MIR_item_t_conflict)pMVar54,
                                  (MIR_insn_t_conflict)unaff_R14,1,0,MVar71,0,
                                  in_stack_fffffffffffff8e0);
                    }
LAB_001353e0:
                    unaff_R14 = paVar44;
                  } while (unaff_R14 != (anon_union_8_10_166bea1d_for_u *)0x0);
                  pMVar42 = unaff_R13[0x1b].func;
                  pMVar51 = (pMVar42->original_insns).head;
                  if (pMVar51 == (MIR_insn_t_conflict)0x0) goto LAB_00136f53;
                }
                if (pMVar51->data != (void *)0x0) goto LAB_00136e63;
                pMVar51 = (pMVar42->original_insns).tail;
                if (pMVar51 == (MIR_insn_t_conflict)0x0) {
                  MIR_link_cold_18();
LAB_00136eda:
                  __assert_fail("item->data == NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                ,0x7b1,
                                "void MIR_link(MIR_context_t, void (*)(MIR_context_t, MIR_item_t), void *(*)(const char *))"
                               );
                }
                if (pMVar51->data != (void *)0x0) goto LAB_00136e63;
                if (local_658 != (anon_union_8_10_166bea1d_for_u *)0x0) {
                  if (local_624 == 0) {
                    paVar50 = unaff_R13;
                    remove_insn((MIR_context_t)unaff_R13,(MIR_item_t_conflict)pMVar54,
                                (MIR_insn_t_conflict)local_658,
                                &((anon_union_8_10_166bea1d_for_u *)&pMVar54->last_temp_num)->func->
                                 insns);
                  }
                  else if (local_630 != local_680) {
                    MVar36 = new_temp_reg((MIR_context_t)unaff_R13,MIR_T_I64,pMVar41);
                    uStack_4f0 = 1;
                    local_4f8.func = (MIR_func_t)0x0;
                    local_578.module = (MIR_module_t)CONCAT71(local_578.module._1_7_,3);
                    local_578.data = (void *)0x0;
                    local_578.item_link.prev = local_630;
                    auVar24[9] = uStack_4ef;
                    auVar24._0_9_ = (unkuint9)1 << 0x40;
                    auVar24._10_6_ = uStack_4ee;
                    in_stack_fffffffffffff8e0 = auVar24._8_4_;
                    in_ZMM1 = ZEXT1664(CONCAT88(pMStack_4e0,CONCAT44(uStack_4e4,MVar36)));
                    MStack_4e8 = MVar36;
                    pMVar51 = MIR_new_insn((MIR_context_t)unaff_R13,MIR_MOV);
                    local_658[10].func = (MIR_func_t)0x0;
                    *(undefined2 *)(local_658 + 0xb) = 1;
                    *(MIR_reg_t *)(local_658 + 0xc) = MVar36;
                    paVar50 = unaff_R13;
                    MIR_insert_insn_before
                              ((MIR_context_t)unaff_R13,(MIR_item_t_conflict)pMVar54,
                               (MIR_insn_t_conflict)local_658,pMVar51);
                  }
                }
                while( true ) {
                  psVar40 = (simplify_ctx *)unaff_R13[0x1b].lref_data;
                  pMVar58 = (MIR_module_t_conflict)psVar40->cold_insns;
                  ctx = (MIR_context_t)unaff_R13;
                  if (pMVar58 == (MIR_module_t_conflict)0x0) goto LAB_00136dab;
                  pvVar38 = pMVar58->data;
                  if (pvVar38 == (void *)0x0) break;
                  pMVar76 = (pMVar58->items).head;
                  if (pMVar76 == (MIR_item_t_conflict)0x0) goto LAB_00136db8;
                  pMVar58->data = (void *)((long)pvVar38 + -1);
                  pMVar51 = *(MIR_insn_t_conflict *)((long)pMVar76 + (long)pvVar38 * 8 + -8);
                  if (*(int *)&pMVar51->field_0x18 == 0xb4) {
                    pMVar75 = (MIR_item_t)psVar40->new_label_num;
                    psVar40->new_label_num = (size_t)((long)&pMVar75->data + 1);
                    pMVar51->ops[0].u.ref = pMVar75;
                  }
                  paVar50 = unaff_R13;
                  MIR_append_insn((MIR_context_t)unaff_R13,(MIR_item_t_conflict)pMVar54,pMVar51);
                }
                if (unaff_R13[0x13].func < (MIR_func_t)psVar40->new_label_num) {
                  unaff_R13[0x13].func = (MIR_func_t)psVar40->new_label_num;
                }
                pMVar54->name = (char *)0x0;
                iVar72 = *(int *)&(pMVar54->insns).tail;
                goto LAB_00136bd6;
              }
            }
            MIR_link_cold_19();
LAB_00136e63:
            __assert_fail("(VARR_MIR_insn_tlength (ctx->simplify_ctx->anchors)) == 0 && (VARR_size_tlength (ctx->simplify_ctx->alloca_sizes)) == 0"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                          ,0x1064,"void process_inlines(MIR_context_t, MIR_item_t)");
          }
        }
        else {
LAB_00136bd6:
          paVar44 = paVar50;
          if (iVar72 == 8) {
            MVar67 = *((((anon_union_8_10_166bea1d_for_u *)&pMVar54->last_temp_num)->expr_data->
                        expr_item->u).func)->res_types;
            if (0xb < (ulong)MVar67) {
LAB_00137049:
              __assert_fail("FALSE",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                            ,0x7ef,
                            "void MIR_link(MIR_context_t, void (*)(MIR_context_t, MIR_item_t), void *(*)(const char *))"
                           );
            }
            pMVar58 = (MIR_module_t_conflict)
                      ((long)&switchD_00136c02::switchdataD_001ac08c +
                      (long)(int)(&switchD_00136c02::switchdataD_001ac08c)[MVar67]);
            uVar33 = local_5b8._4_6_;
            switch(MVar67) {
            case MIR_T_I8:
            case MIR_T_U8:
              pMVar58 = (MIR_module_t_conflict)CONCAT71((int7)((ulong)pMVar58 >> 8),local_5a8);
              local_5b8 = CONCAT91(local_5b8._1_9_,local_5a8);
              break;
            case MIR_T_I16:
            case MIR_T_U16:
              pMVar58 = (MIR_module_t_conflict)(ulong)CONCAT11(uStack_5a7,local_5a8);
              local_5b8 = CONCAT82(local_5b8._2_8_,CONCAT11(uStack_5a7,local_5a8));
              break;
            case MIR_T_I32:
            case MIR_T_U32:
              uVar52 = CONCAT22(uStack_5a6,CONCAT11(uStack_5a7,local_5a8));
              pMVar58 = (MIR_module_t_conflict)(ulong)uVar52;
              local_5b8 = CONCAT64(uVar33,uVar52);
              break;
            default:
              pMVar58 = (MIR_module_t_conflict)
                        CONCAT44(uStack_5a4,CONCAT22(uStack_5a6,CONCAT11(uStack_5a7,local_5a8)));
              local_5b8 = CONCAT28(local_5b8._8_2_,pMVar58);
              break;
            case MIR_T_F:
              local_5b8 = CONCAT64(uVar33,CONCAT22(uStack_5a6,CONCAT11(uStack_5a7,local_5a8)));
              break;
            case MIR_T_D:
              local_5b8 = CONCAT28(local_5b8._8_2_,
                                   CONCAT44(uStack_5a4,
                                            CONCAT22(uStack_5a6,CONCAT11(uStack_5a7,local_5a8))));
              break;
            case MIR_T_LD:
              local_5b8 = CONCAT28(uStack_5a0,
                                   CONCAT44(uStack_5a4,
                                            CONCAT22(uStack_5a6,CONCAT11(uStack_5a7,local_5a8))));
            }
            paVar44 = (anon_union_8_10_166bea1d_for_u *)
                      ((anon_union_8_10_166bea1d_for_u *)&pMVar54->last_temp_num)->expr_data->
                      load_addr;
            in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
            sVar64 = _MIR_type_size((MIR_context_t)paVar50,MVar67);
            memcpy(paVar44,&local_5b8,sVar64);
          }
        }
        pMVar54 = (MIR_func_t)(pMVar54->insns).head;
        paVar50 = paVar44;
      } while (pMVar54 != (MIR_func_t)0x0);
      pMVar41 = (MIR_func_t)unaff_R13[0x16].proto;
    }
    pMVar59 = (MIR_module_t_conflict)((long)&pMVar59->data + 1);
    paVar50 = paVar44;
  } while (pMVar41 != (MIR_func_t)0x0);
  MIR_link_cold_22();
  pMVar41 = extraout_RAX_00;
LAB_00136ccd:
  if (local_580 != (_func_void_MIR_context_t_MIR_item_t *)0x0) {
    while (pMVar58 != (MIR_module_t_conflict)0x0) {
      if ((MIR_module_t_conflict *)pMVar41->original_vars_num == (MIR_module_t_conflict *)0x0) {
        MIR_link_cold_2();
LAB_00137073:
        MIR_link_cold_1();
LAB_0013707b:
        MIR_link_cold_10();
LAB_00137080:
        MIR_link_cold_9();
LAB_00137085:
        MIR_link_cold_8();
LAB_0013708a:
        MIR_link_cold_13();
LAB_0013708f:
        MIR_link_cold_12();
LAB_00137094:
        MIR_link_cold_11();
        return;
      }
      pMVar41->name = &pMVar58[-1].field_0x37;
      pMVar76 = (((MIR_module_t_conflict *)pMVar41->original_vars_num)
                 [(long)&pMVar58[-1].field_0x37]->items).head;
      if (pMVar76 != (MIR_item_t_conflict)0x0) {
        do {
          if (pMVar76->item_type == MIR_func_item) {
            (*local_580)((MIR_context_t)unaff_R13,pMVar76);
          }
          pMVar76 = (pMVar76->item_link).next;
        } while (pMVar76 != (MIR_item_t)0x0);
        pMVar41 = unaff_R13[0x16].func;
        if (pMVar41 == (MIR_func_t)0x0) goto LAB_00137073;
      }
      pMVar58 = (MIR_module_t_conflict)pMVar41->name;
    }
    (*local_580)((MIR_context_t)unaff_R13,(MIR_item_t_conflict)0x0);
  }
  return;
code_r0x00135368:
  pMVar42 = (MIR_func_t)(pMVar42->original_insns).head;
  goto LAB_00135358;
LAB_00136dab:
  MIR_link_cold_17();
  unaff_R13 = (anon_union_8_10_166bea1d_for_u *)ctx;
LAB_00136db0:
  MIR_link_cold_37();
LAB_00136db8:
  MIR_link_cold_16();
  ctx = (MIR_context_t)unaff_R13;
  unaff_R14 = local_658;
LAB_00136dbd:
  MIR_link_cold_35();
  unaff_R13 = (anon_union_8_10_166bea1d_for_u *)ctx;
LAB_00136dc5:
  MIR_link_cold_36();
LAB_00136dcd:
  MIR_link_cold_15();
LAB_00136dd2:
  MIR_link_cold_34();
LAB_00136dda:
  MIR_link_cold_4();
LAB_00136ddf:
  MIR_link_cold_28();
LAB_00136de7:
  MIR_link_cold_30();
  ctx = (MIR_context_t)unaff_R13;
LAB_00136def:
  pcVar70 = "undeclared func reg %s";
  uVar73 = 0xf;
LAB_00136f26:
  (*(code *)*(anon_union_8_10_166bea1d_for_u *)((long)ctx + 0x10))(uVar73,pcVar70,unaff_R14);
LAB_00136f2c:
  MIR_link_cold_33();
LAB_00136f34:
  __assert_fail("(DLIST_MIR_insn_t_next (insn)) == stop_insn && call->ops[0].mode == MIR_OP_REF && call->ops[0].u.ref->item_type == MIR_proto_item"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                ,0x1027,"void process_inlines(MIR_context_t, MIR_item_t)");
LAB_00136f53:
  MIR_link_cold_14();
LAB_00136f58:
  MIR_link_cold_32();
LAB_00136f60:
  MIR_link_cold_27();
LAB_00136f68:
  MIR_link_cold_6();
LAB_00136f70:
  MIR_link_cold_5();
LAB_00136f75:
  MIR_link_cold_40();
LAB_00136f7d:
  __assert_fail("tab_item != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                ,0x7ba,
                "void MIR_link(MIR_context_t, void (*)(MIR_context_t, MIR_item_t), void *(*)(const char *))"
               );
}

Assistant:

void MIR_link (MIR_context_t ctx, void (*set_interface) (MIR_context_t ctx, MIR_item_t item),
               void *import_resolver (const char *)) {
  MIR_item_t item, tab_item, expr_item;
  MIR_type_t type;
  MIR_val_t res;
  MIR_module_t m;
  void *addr;
  union {
    int8_t i8;
    int16_t i16;
    int32_t i32;
    int64_t i64;
    float f;
    double d;
    long double ld;
    void *a;
  } v;

  for (size_t i = 0; i < VARR_LENGTH (MIR_module_t, modules_to_link); i++) {
    m = VARR_GET (MIR_module_t, modules_to_link, i);
    simplify_module_init (ctx);
    for (item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
         item = DLIST_NEXT (MIR_item_t, item))
      if (item->item_type == MIR_func_item) {
        assert (item->data == NULL);
        if (simplify_func (ctx, item, TRUE)) item->data = (void *) 1; /* flag inlining */
      } else if (item->item_type == MIR_import_item) {
        if ((tab_item = item_tab_find (ctx, item->u.import_id, &environment_module)) == NULL) {
          if (import_resolver == NULL || (addr = import_resolver (item->u.import_id)) == NULL)
            MIR_get_error_func (ctx) (MIR_undeclared_op_ref_error, "import of undefined item %s",
                                      item->u.import_id);
          MIR_load_external (ctx, item->u.import_id, addr);
          tab_item = item_tab_find (ctx, item->u.import_id, &environment_module);
          mir_assert (tab_item != NULL);
        }
        item->addr = tab_item->addr;
        item->ref_def = tab_item;
      } else if (item->item_type == MIR_export_item) {
        if ((tab_item = item_tab_find (ctx, item->u.export_id, m)) == NULL)
          MIR_get_error_func (ctx) (MIR_undeclared_op_ref_error, "export of undefined item %s",
                                    item->u.export_id);
        item->addr = tab_item->addr;
        item->ref_def = tab_item;
      } else if (item->item_type == MIR_forward_item) {
        if ((tab_item = item_tab_find (ctx, item->u.forward_id, m)) == NULL)
          MIR_get_error_func (ctx) (MIR_undeclared_op_ref_error, "forward of undefined item %s",
                                    item->u.forward_id);
        item->addr = tab_item->addr;
        item->ref_def = tab_item;
      }
  }
  for (size_t i = 0; i < VARR_LENGTH (MIR_module_t, modules_to_link); i++) {
    m = VARR_GET (MIR_module_t, modules_to_link, i);
    for (item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
         item = DLIST_NEXT (MIR_item_t, item)) {
      if (item->item_type == MIR_func_item && item->data != NULL) {
        process_inlines (ctx, item);
        item->data = NULL;
#if 0
        fprintf (stderr, "+++++ Function after inlining:\n");
        MIR_output_item (ctx, stderr, item);
#endif
      } else if (item->item_type == MIR_ref_data_item) {
        assert (item->u.ref_data->ref_item->addr != NULL);
        addr = (char *) item->u.ref_data->ref_item->addr + item->u.ref_data->disp;
        memcpy (item->u.ref_data->load_addr, &addr, _MIR_type_size (ctx, MIR_T_P));
        continue;
      }
      /* lref data are set up in interpreter or generator */
      if (item->item_type != MIR_expr_data_item) continue;
      expr_item = item->u.expr_data->expr_item;
      MIR_interp (ctx, expr_item, &res, 0);
      type = expr_item->u.func->res_types[0];
      switch (type) {
      case MIR_T_I8:
      case MIR_T_U8: v.i8 = (int8_t) res.i; break;
      case MIR_T_I16:
      case MIR_T_U16: v.i16 = (int16_t) res.i; break;
      case MIR_T_I32:
      case MIR_T_U32: v.i32 = (int32_t) res.i; break;
      case MIR_T_I64:
      case MIR_T_U64: v.i64 = (int64_t) res.i; break;
      case MIR_T_F: v.f = res.f; break;
      case MIR_T_D: v.d = res.d; break;
      case MIR_T_LD: v.ld = res.ld; break;
      case MIR_T_P: v.a = res.a; break;
      default: assert (FALSE); break;
      }
      memcpy (item->u.expr_data->load_addr, &v,
              _MIR_type_size (ctx, expr_item->u.func->res_types[0]));
    }
  }
  if (set_interface != NULL) {
    while (VARR_LENGTH (MIR_module_t, modules_to_link) != 0) {
      m = VARR_POP (MIR_module_t, modules_to_link);
      for (item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
           item = DLIST_NEXT (MIR_item_t, item))
        if (item->item_type == MIR_func_item) {
          finish_func_interpretation (item); /* in case if it was used for expr data */
          set_interface (ctx, item);
        }
    }
    set_interface (ctx, NULL); /* finish interface setting */
  }
}